

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_msmblur.h
# Opt level: O1

NodeRecordMB4D * __thiscall
embree::sse2::BVHBuilderMSMBlur::
BuilderT<embree::NodeRefPtr<4>,_embree::sse2::RecalculatePrimRef<embree::QuadMesh>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeaf<4,_embree::QuadMesh,_embree::QuadMi<4>_>,_embree::Scene::BuildProgressMonitorInterface>
::createLargeLeaf(NodeRecordMB4D *__return_storage_ptr__,
                 BuilderT<embree::NodeRefPtr<4>,_embree::sse2::RecalculatePrimRef<embree::QuadMesh>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeaf<4,_embree::QuadMesh,_embree::QuadMi<4>_>,_embree::Scene::BuildProgressMonitorInterface>
                 *this,BuildRecord *in,CachedAllocator alloc)

{
  atomic<unsigned_long> *paVar1;
  pointer *pppTVar2;
  Split *pSVar3;
  char *pcVar4;
  BBox1f BVar5;
  size_t end;
  MemoryMonitorInterface *pMVar6;
  Split *pSVar7;
  vint *pvVar8;
  code *pcVar9;
  ThreadLocal2 *pTVar10;
  iterator iVar11;
  BBox1f *pBVar12;
  PrimRefMB *pPVar13;
  Scene *pSVar14;
  Geometry *pGVar15;
  long lVar16;
  long lVar17;
  uint uVar18;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar19;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar20;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar21;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar22;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar23;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar24;
  bool bVar25;
  bool bVar26;
  undefined4 uVar27;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar28;
  vint *pvVar29;
  undefined8 uVar30;
  char cVar31;
  int iVar32;
  long lVar33;
  long lVar34;
  BBox1f BVar35;
  void *pvVar36;
  ulong uVar37;
  float *pfVar38;
  size_t sVar39;
  undefined8 *puVar40;
  runtime_error *prVar41;
  ulong *puVar42;
  PrimRefMB *pPVar43;
  char *pcVar44;
  ulong uVar45;
  uint uVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  long lVar50;
  ulong uVar51;
  long *plVar52;
  long lVar53;
  long lVar54;
  BBox1f *pBVar55;
  long lVar56;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *this_00;
  BuildRecord *in_00;
  ulong uVar57;
  mvector<PrimRefMB> *prims;
  long lVar58;
  bool bVar59;
  float fVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar65;
  float fVar66;
  float fVar68;
  float fVar69;
  undefined1 auVar67 [16];
  float fVar70;
  float fVar71;
  undefined1 auVar72 [16];
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar79;
  float fVar80;
  float fVar81;
  undefined1 auVar78 [16];
  float fVar82;
  float fVar84;
  undefined1 auVar83 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  float fVar87;
  undefined1 auVar88 [16];
  float fVar89;
  float fVar90;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar94;
  float fVar95;
  undefined1 auVar93 [16];
  float fVar96;
  task_group_context *in_stack_ffffffffffffe168;
  unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  new_vector;
  undefined1 local_1e78 [16];
  undefined1 local_1e58 [16];
  undefined1 local_1e38 [16];
  undefined1 local_1e28 [16];
  BBox1f time_range1;
  BBox1f time_range0;
  PrimRefVector lprims;
  PrimInfoMB right;
  vuint<4> v2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1d18;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1d08;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1cf8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1ce8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1cd8;
  size_t local_1cc8;
  size_t sStack_1cc0;
  size_t local_1cb8;
  size_t sStack_1cb0;
  float local_1ca8;
  float fStack_1ca4;
  float fStack_1ca0;
  float fStack_1c9c;
  vuint<4> v0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1c88;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1c78;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1c68;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1c58;
  BBox1f local_1c48;
  char acStack_1c40 [24];
  size_t local_1c28;
  size_t sStack_1c20;
  size_t local_1c18;
  size_t sStack_1c10;
  BBox1f local_1c08;
  BBox1f BStack_1c00;
  BBox1f local_1bf8;
  undefined8 local_1be8;
  undefined8 uStack_1be0;
  BBox1f local_1bd8;
  BBox1f local_1bc8;
  BBox1f BStack_1bc0;
  BBox1f local_1bb8;
  BBox1f BStack_1bb0;
  anon_class_1_0_00000001 reduction;
  undefined1 local_1b88 [16];
  undefined1 local_1b78 [16];
  undefined1 local_1b68 [32];
  vuint<4> v1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1b38;
  size_t local_1b28;
  BBox1f BStack_1b20;
  BBox1f local_1b18;
  undefined8 uStack_1b10;
  undefined8 local_1b08;
  undefined8 uStack_1b00;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1af8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1ae8;
  size_t local_1ad8;
  size_t sStack_1ad0;
  size_t local_1ac8;
  size_t sStack_1ac0;
  BBox1f local_1ab8;
  BBox1f BStack_1ab0;
  BBox1f local_1aa8;
  undefined8 local_1a98;
  undefined8 uStack_1a90;
  BBox1f local_1a88;
  BBox1f local_1a78;
  BBox1f BStack_1a70;
  BBox1f local_1a68;
  BBox1f BStack_1a60;
  vbool vSplitMask;
  anon_class_1_0_00000001 reduction2;
  undefined1 local_19f8 [16];
  anon_class_24_3_c5d13451 isLeft;
  vint vSplitPos;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_18c8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_18b8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_18a8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1898;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1888;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1878;
  ulong local_1868;
  ulong uStack_1860;
  size_t local_1858;
  undefined8 uStack_1850;
  undefined8 local_1848;
  BBox1f BStack_1840;
  BBox1f local_1838;
  longlong local_1828;
  size_t local_1818;
  undefined8 local_1808;
  undefined8 uStack_1800;
  undefined8 local_17f8;
  undefined8 uStack_17f0;
  undefined1 local_17e8 [16];
  float local_17d8;
  float fStack_17d4;
  float fStack_17d0;
  float fStack_17cc;
  vuint<4> geomID;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_17b8;
  undefined1 local_17a8 [16];
  undefined1 local_1798 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1788;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1778;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1768;
  ulong local_1758 [2];
  size_t local_1748 [2];
  BBox1f local_1738;
  float fStack_1730;
  float fStack_172c;
  BBox1f local_1728 [2];
  undefined1 local_1718 [32];
  BBox1f local_16f8 [454];
  BBox1f *local_8c8 [16];
  ulong local_848;
  BBox1f local_840;
  BBox1f local_838 [63];
  long local_640;
  NodeRecordMB4D values [16];
  
  uVar37 = in->depth;
  if ((this->cfg).maxDepth < uVar37) {
    puVar40 = (undefined8 *)__cxa_allocate_exception(0x30);
    geomID.field_0.v[0] = (longlong)&local_17b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&geomID,"depth limit reached","");
    *puVar40 = &PTR__rtcore_error_022018b0;
    *(undefined4 *)(puVar40 + 1) = 1;
    puVar40[2] = puVar40 + 4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar40 + 2),geomID.field_0.v[0],
               CONCAT44(geomID.field_0.i[3],geomID.field_0.i[2]) + geomID.field_0.v[0]);
    __cxa_throw(puVar40,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
  }
  aVar19 = (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
           bounds0.lower.field_0;
  aVar20 = (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
           bounds0.upper.field_0;
  aVar21 = (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
           bounds1.lower.field_0;
  aVar22 = (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
           bounds1.upper.field_0;
  aVar23 = (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.
           lower.field_0;
  aVar24 = (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.
           upper.field_0;
  values[0].lbounds.bounds0.lower.field_0._0_8_ = (in->prims).super_PrimInfoMB.max_time_range;
  values[0].lbounds.bounds0.lower.field_0._8_8_ = (in->prims).super_PrimInfoMB.time_range;
  values[0].ref.ptr = (in->prims).super_PrimInfoMB.num_time_segments;
  values[0]._8_8_ = (in->prims).super_PrimInfoMB.max_num_time_segments;
  BVar5 = (BBox1f)(in->prims).prims;
  uVar57 = (in->prims).super_PrimInfoMB.object_range._begin;
  uVar45 = (in->prims).super_PrimInfoMB.object_range._end;
  findFallback((Split *)&geomID,this,&in->prims);
  local_1858 = values[0].ref.ptr;
  uStack_1850 = values[0]._8_8_;
  local_1848 = values[0].lbounds.bounds0.lower.field_0._0_8_;
  BStack_1840.lower = (float)values[0].lbounds.bounds0.lower.field_0._8_4_;
  BStack_1840.upper = (float)values[0].lbounds.bounds0.lower.field_0._12_4_;
  BVar35 = BStack_1840;
  local_1828 = geomID.field_0.v[0];
  local_1818 = local_17b8._0_8_;
  local_1808 = local_17a8._0_8_;
  uStack_1800 = local_17a8._8_8_;
  local_17f8 = local_1798._0_8_;
  uStack_17f0 = local_1798._8_8_;
  if ((uVar37 == 1) && (uVar45 != uVar57)) {
    BStack_1840.lower = (float)values[0].lbounds.bounds0.lower.field_0._8_8_;
    BStack_1840.upper = (float)((ulong)values[0].lbounds.bounds0.lower.field_0._8_8_ >> 0x20);
    lVar33 = uVar45 - uVar57;
    if (uVar45 < uVar57 || lVar33 == 0) {
      fVar87 = INFINITY;
      fVar90 = -INFINITY;
    }
    else {
      pfVar38 = &(*(PrimRefMB **)((long)BVar5 + 0x20))[uVar57].time_range.upper;
      fVar87 = INFINITY;
      fVar89 = -INFINITY;
      do {
        if (((BBox1f *)(pfVar38 + -1))->lower <= fVar87) {
          fVar87 = ((BBox1f *)(pfVar38 + -1))->lower;
        }
        fVar90 = *pfVar38;
        if (*pfVar38 <= fVar89) {
          fVar90 = fVar89;
        }
        pfVar38 = pfVar38 + 0x14;
        lVar33 = lVar33 + -1;
        fVar89 = fVar90;
      } while (lVar33 != 0);
    }
    bVar25 = BStack_1840.lower < fVar87 || fVar90 < BStack_1840.upper;
  }
  else {
    bVar25 = false;
  }
  local_18c8 = aVar19;
  local_18b8 = aVar20;
  local_18a8 = aVar21;
  local_1898 = aVar22;
  local_1888 = aVar23;
  local_1878 = aVar24;
  local_1868 = uVar57;
  uStack_1860 = uVar45;
  BStack_1840 = BVar35;
  local_1838 = BVar5;
  if (((uVar45 - uVar57 <= (this->cfg).maxLeafSize) && ((uint)geomID.field_0._12_4_ < 2)) &&
     (!bVar25)) {
    uVar45 = (uVar45 - uVar57) + 3;
    uVar37 = uVar45 >> 2;
    v1.field_0.v[0] = uVar37 * 0x60;
    pTVar10 = (alloc.talloc1)->parent;
    if (alloc.alloc != (pTVar10->alloc)._M_b._M_p) {
      values[0]._8_1_ = 1;
      values[0].ref.ptr = (size_t)pTVar10;
      MutexSys::lock(&pTVar10->mutex);
      if ((pTVar10->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar1 = &((pTVar10->alloc)._M_b._M_p)->bytesUsed;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (pTVar10->alloc1).bytesUsed + (pTVar10->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar1 = &((pTVar10->alloc)._M_b._M_p)->bytesFree;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (((pTVar10->alloc0).end + (pTVar10->alloc1).end) -
             ((pTVar10->alloc0).cur + (pTVar10->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar1 = &((pTVar10->alloc)._M_b._M_p)->bytesWasted;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (pTVar10->alloc1).bytesWasted + (pTVar10->alloc0).bytesWasted;
        UNLOCK();
      }
      (pTVar10->alloc0).bytesUsed = 0;
      (pTVar10->alloc0).bytesWasted = 0;
      (pTVar10->alloc0).end = 0;
      (pTVar10->alloc0).allocBlockSize = 0;
      (pTVar10->alloc0).ptr = (char *)0x0;
      (pTVar10->alloc0).cur = 0;
      if (alloc.alloc == (FastAllocator *)0x0) {
        (pTVar10->alloc1).bytesUsed = 0;
        (pTVar10->alloc1).bytesWasted = 0;
        (pTVar10->alloc1).end = 0;
        (pTVar10->alloc1).allocBlockSize = 0;
        (pTVar10->alloc1).ptr = (char *)0x0;
        (pTVar10->alloc1).cur = 0;
      }
      else {
        (pTVar10->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
        (pTVar10->alloc1).ptr = (char *)0x0;
        (pTVar10->alloc1).cur = 0;
        (pTVar10->alloc1).end = 0;
        (pTVar10->alloc1).allocBlockSize = 0;
        (pTVar10->alloc1).bytesUsed = 0;
        (pTVar10->alloc1).bytesWasted = 0;
        (pTVar10->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (pTVar10->alloc)._M_b._M_p = alloc.alloc;
      UNLOCK();
      geomID.field_0.v[0] = (longlong)&FastAllocator::s_thread_local_allocators_lock;
      geomID.field_0.v[1]._0_1_ = 1;
      v0.field_0.v[0] = (longlong)pTVar10;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      iVar11._M_current =
           ((alloc.alloc)->thread_local_allocators).
           super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar11._M_current ==
          ((alloc.alloc)->thread_local_allocators).
          super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
        ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                  ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                    *)&(alloc.alloc)->thread_local_allocators,iVar11,(ThreadLocal2 **)&v0);
      }
      else {
        *iVar11._M_current = (ThreadLocal2 *)v0.field_0.v[0];
        pppTVar2 = &((alloc.alloc)->thread_local_allocators).
                    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar2 = *pppTVar2 + 1;
      }
      if (geomID.field_0.v[1]._0_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)geomID.field_0.v[0]);
      }
      if (values[0]._8_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)values[0].ref.ptr);
      }
    }
    (alloc.talloc1)->bytesUsed = (alloc.talloc1)->bytesUsed + v1.field_0.v[0];
    sVar39 = (alloc.talloc1)->cur;
    uVar47 = (ulong)(-(int)sVar39 & 0xf);
    uVar49 = sVar39 + v1.field_0.v[0] + uVar47;
    (alloc.talloc1)->cur = uVar49;
    if ((alloc.talloc1)->end < uVar49) {
      (alloc.talloc1)->cur = sVar39;
      if ((alloc.talloc1)->allocBlockSize < (ulong)(v1.field_0.v[0] << 2)) {
        pcVar44 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&v1);
      }
      else {
        geomID.field_0.v[0] = (alloc.talloc1)->allocBlockSize;
        pcVar44 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&geomID);
        (alloc.talloc1)->ptr = pcVar44;
        sVar39 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
        (alloc.talloc1)->bytesWasted = sVar39;
        (alloc.talloc1)->cur = 0;
        (alloc.talloc1)->end = geomID.field_0.v[0];
        (alloc.talloc1)->cur = v1.field_0.v[0];
        if ((ulong)geomID.field_0.v[0] < (ulong)v1.field_0.v[0]) {
          (alloc.talloc1)->cur = 0;
          geomID.field_0.v[0] = (alloc.talloc1)->allocBlockSize;
          pcVar44 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&geomID);
          (alloc.talloc1)->ptr = pcVar44;
          sVar39 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
          (alloc.talloc1)->bytesWasted = sVar39;
          (alloc.talloc1)->cur = 0;
          (alloc.talloc1)->end = geomID.field_0.v[0];
          (alloc.talloc1)->cur = v1.field_0.v[0];
          if ((ulong)geomID.field_0.v[0] < (ulong)v1.field_0.v[0]) {
            (alloc.talloc1)->cur = 0;
            pcVar44 = (char *)0x0;
            goto LAB_00d3d7c4;
          }
        }
        (alloc.talloc1)->bytesWasted = sVar39;
      }
    }
    else {
      (alloc.talloc1)->bytesWasted = (alloc.talloc1)->bytesWasted + uVar47;
      pcVar44 = (alloc.talloc1)->ptr + (uVar49 - v1.field_0._0_8_);
    }
LAB_00d3d7c4:
    uVar47 = 7;
    if (uVar37 < 7) {
      uVar47 = uVar37;
    }
    local_17e8 = _DAT_01feb9f0;
    if (uVar45 < 4) {
      local_1b88 = _DAT_01feb9f0;
      local_1b68._8_8_ = 0xff800000ff800000;
      local_1b68._0_8_ = 0xff800000ff800000;
      local_1b78._8_8_ = 0xff800000ff800000;
      local_1b78._0_8_ = 0xff800000ff800000;
    }
    else {
      lVar33 = 0;
      local_1b78._8_8_ = 0xff800000ff800000;
      local_1b78._0_8_ = 0xff800000ff800000;
      local_1b88 = _DAT_01feb9f0;
      local_1b68._8_8_ = 0xff800000ff800000;
      local_1b68._0_8_ = 0xff800000ff800000;
      do {
        BVar5 = BStack_1840;
        pPVar13 = *(PrimRefMB **)((long)local_1838 + 0x20);
        pSVar14 = ((this->createLeaf).bvh)->scene;
        geomID.field_0.v[0] = -1;
        geomID.field_0.i[2] = 0xffffffff;
        geomID.field_0.i[3] = 0xffffffff;
        values[0].ref.ptr = 0xffffffffffffffff;
        values[0]._8_8_ = 0xffffffffffffffff;
        pPVar43 = pPVar13 + uVar57;
        v0.field_0.v[0] = 0;
        v0.field_0.v[1] = 0;
        v1.field_0.v[0] = 0;
        v1.field_0.v[1] = 0;
        v2.field_0.v[0] = 0;
        v2.field_0.v[1] = 0;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_
             = 0;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_
             = 0;
        lVar34 = 0;
        do {
          if (uVar57 < uStack_1860) {
            fVar90 = (pPVar43->lbounds).bounds0.lower.field_0.m128[3];
            *(float *)((long)&geomID.field_0 + lVar34) = fVar90;
            fVar87 = (pPVar43->lbounds).bounds0.upper.field_0.m128[3];
            *(float *)((long)&values[0].ref.ptr + lVar34) = fVar87;
            pGVar15 = (pSVar14->geometries).items[(uint)fVar90].ptr;
            lVar50 = (ulong)(uint)fVar87 *
                     pGVar15[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
            lVar58 = *(long *)&pGVar15->field_0x58;
            uVar46 = *(uint *)&pGVar15[1].intersectionFilterN >> 2;
            *(uint *)((long)&v0.field_0 + lVar34) = *(int *)(lVar58 + lVar50) * uVar46;
            *(uint *)((long)&v1.field_0 + lVar34) = *(int *)(lVar58 + 4 + lVar50) * uVar46;
            *(uint *)((long)&v2.field_0 + lVar34) = *(int *)(lVar58 + 8 + lVar50) * uVar46;
            *(uint *)((long)&right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0
                             .lower.field_0 + lVar34) = uVar46 * *(int *)(lVar58 + 0xc + lVar50);
            uVar57 = uVar57 + 1;
          }
          else if (lVar34 != 0) {
            *(uint *)((long)&geomID.field_0 + lVar34) = geomID.field_0.i[0];
            *(undefined4 *)((long)&values[0].ref.ptr + lVar34) = 0xffffffff;
            uVar27 = v0.field_0.i[0];
            *(uint *)((long)&v0.field_0 + lVar34) = v0.field_0.i[0];
            *(undefined4 *)((long)&v1.field_0 + lVar34) = uVar27;
            *(undefined4 *)((long)&v2.field_0 + lVar34) = uVar27;
            *(undefined4 *)
             ((long)&right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                     field_0 + lVar34) = uVar27;
          }
          if (uVar57 < uStack_1860) {
            pPVar43 = pPVar13 + uVar57;
          }
          lVar34 = lVar34 + 4;
        } while (lVar34 != 0x10);
        lVar34 = lVar33 * 0x60;
        *(longlong *)(pcVar44 + lVar34) = v0.field_0.v[0];
        *(longlong *)((long)(pcVar44 + lVar34) + 8) = v0.field_0.v[1];
        *(longlong *)(pcVar44 + lVar34 + 0x10) = v1.field_0.v[0];
        *(longlong *)((long)(pcVar44 + lVar34 + 0x10) + 8) = v1.field_0.v[1];
        *(longlong *)(pcVar44 + lVar34 + 0x20) = v2.field_0.v[0];
        *(longlong *)((long)(pcVar44 + lVar34 + 0x20) + 8) = v2.field_0.v[1];
        *(undefined8 *)(pcVar44 + lVar34 + 0x30) =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        *(undefined8 *)(pcVar44 + lVar34 + 0x30 + 8) =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _8_8_;
        *(longlong *)(pcVar44 + lVar34 + 0x40) = geomID.field_0.v[0];
        *(longlong *)((long)(pcVar44 + lVar34 + 0x40) + 8) =
             CONCAT44(geomID.field_0.i[3],geomID.field_0.i[2]);
        *(size_t *)(pcVar44 + lVar34 + 0x50) = values[0].ref.ptr;
        *(undefined8 *)((long)(pcVar44 + lVar34 + 0x50) + 8) = values[0]._8_8_;
        local_1b68._20_4_ = BStack_1840.upper;
        local_17d8 = (float)local_1b68._20_4_;
        fStack_17d4 = (float)local_1b68._20_4_;
        fStack_17d0 = (float)local_1b68._20_4_;
        fStack_17cc = (float)local_1b68._20_4_;
        lVar58 = 0;
        auVar61 = _DAT_01feb9f0;
        auVar62 = _DAT_01feb9f0;
        auVar83 = _DAT_01feba00;
        auVar85 = _DAT_01feba00;
        do {
          uVar46 = *(uint *)(pcVar44 + lVar58 * 4 + lVar34 + 0x50);
          if ((ulong)uVar46 == 0xffffffff) break;
          pGVar15 = (pSVar14->geometries).items[*(uint *)(pcVar44 + lVar58 * 4 + lVar34 + 0x40)].ptr
          ;
          fVar90 = pGVar15->fnumTimeSegments;
          fVar87 = (pGVar15->time_range).lower;
          local_1b68._16_4_ = BVar5.lower;
          fVar96 = (pGVar15->time_range).upper - fVar87;
          fVar94 = ((float)local_1b68._16_4_ - fVar87) / fVar96;
          fVar96 = (local_17d8 - fVar87) / fVar96;
          fVar95 = fVar90 * fVar96;
          fVar87 = floorf(fVar90 * fVar94);
          fVar89 = ceilf(fVar95);
          iVar32 = (int)fVar87;
          if (fVar87 <= 0.0) {
            fVar87 = 0.0;
          }
          fVar60 = fVar89;
          if (fVar90 <= fVar89) {
            fVar60 = fVar90;
          }
          if (iVar32 < 0) {
            iVar32 = -1;
          }
          uVar18 = (int)fVar90 + 1U;
          if ((int)fVar89 < (int)((int)fVar90 + 1U)) {
            uVar18 = (int)fVar89;
          }
          lVar50 = *(long *)&pGVar15->field_0x58;
          lVar56 = (ulong)uVar46 *
                   pGVar15[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
          uVar45 = (ulong)*(uint *)(lVar50 + lVar56);
          uVar49 = (ulong)*(uint *)(lVar50 + 4 + lVar56);
          lVar16 = *(long *)&pGVar15[2].numPrimitives;
          lVar53 = (long)(int)fVar87 * 0x38;
          lVar17 = *(long *)(lVar16 + lVar53);
          lVar54 = *(long *)(lVar16 + 0x10 + lVar53);
          auVar88 = *(undefined1 (*) [16])(lVar17 + lVar54 * uVar45);
          auVar91 = *(undefined1 (*) [16])(lVar17 + lVar54 * uVar49);
          uVar48 = (ulong)*(uint *)(lVar50 + 8 + lVar56);
          auVar64 = *(undefined1 (*) [16])(lVar17 + lVar54 * uVar48);
          uVar51 = (ulong)*(uint *)(lVar50 + 0xc + lVar56);
          auVar67 = *(undefined1 (*) [16])(lVar17 + lVar54 * uVar51);
          auVar63 = minps(auVar88,auVar91);
          auVar78 = minps(auVar64,auVar67);
          auVar63 = minps(auVar63,auVar78);
          auVar91 = maxps(auVar88,auVar91);
          auVar88 = maxps(auVar64,auVar67);
          auVar72 = maxps(auVar91,auVar88);
          lVar54 = (long)(int)fVar60 * 0x38;
          lVar50 = *(long *)(lVar16 + lVar54);
          lVar17 = *(long *)(lVar16 + 0x10 + lVar54);
          auVar88 = *(undefined1 (*) [16])(lVar50 + lVar17 * uVar45);
          auVar91 = *(undefined1 (*) [16])(lVar50 + lVar17 * uVar49);
          auVar64 = *(undefined1 (*) [16])(lVar50 + lVar17 * uVar48);
          auVar67 = *(undefined1 (*) [16])(lVar50 + lVar17 * uVar51);
          auVar78 = minps(auVar88,auVar91);
          auVar86 = minps(auVar64,auVar67);
          auVar78 = minps(auVar78,auVar86);
          auVar91 = maxps(auVar88,auVar91);
          auVar88 = maxps(auVar64,auVar67);
          auVar88 = maxps(auVar91,auVar88);
          fVar87 = fVar90 * fVar94 - fVar87;
          fVar70 = auVar78._0_4_;
          fVar89 = auVar63._0_4_;
          fVar77 = auVar88._0_4_;
          fVar79 = auVar88._4_4_;
          fVar80 = auVar88._8_4_;
          fVar82 = auVar88._12_4_;
          fVar76 = auVar72._0_4_;
          fVar81 = auVar72._4_4_;
          fVar84 = auVar72._8_4_;
          fVar73 = auVar72._12_4_;
          fVar65 = auVar63._4_4_;
          fVar68 = auVar63._8_4_;
          fVar69 = auVar63._12_4_;
          fVar71 = auVar78._4_4_;
          fVar74 = auVar78._8_4_;
          fVar75 = auVar78._12_4_;
          if (uVar18 - iVar32 == 1) {
            if (fVar87 <= 0.0) {
              fVar87 = 0.0;
            }
            fVar90 = 1.0 - fVar87;
            auVar64._4_4_ = fVar90 * fVar65 + fVar87 * fVar71;
            auVar64._0_4_ = fVar90 * fVar89 + fVar87 * fVar70;
            auVar67._0_4_ = fVar90 * fVar76 + fVar87 * fVar77;
            auVar67._4_4_ = fVar90 * fVar81 + fVar87 * fVar79;
            auVar67._8_4_ = fVar90 * fVar84 + fVar87 * fVar80;
            auVar67._12_4_ = fVar90 * fVar73 + fVar87 * fVar82;
            fVar60 = fVar60 - fVar95;
            if (fVar60 <= 0.0) {
              fVar60 = 0.0;
            }
            fVar96 = 1.0 - fVar60;
            auVar63._0_4_ = fVar70 * fVar96 + fVar89 * fVar60;
            auVar63._4_4_ = fVar71 * fVar96 + fVar65 * fVar60;
            auVar63._8_4_ = fVar74 * fVar96 + fVar68 * fVar60;
            auVar63._12_4_ = fVar75 * fVar96 + fVar69 * fVar60;
            auVar78._0_4_ = fVar96 * fVar77 + fVar60 * fVar76;
            auVar78._4_4_ = fVar96 * fVar79 + fVar60 * fVar81;
            auVar78._8_4_ = fVar96 * fVar80 + fVar60 * fVar84;
            auVar78._12_4_ = fVar96 * fVar82 + fVar60 * fVar73;
            auVar64._8_4_ = fVar90 * fVar68 + fVar87 * fVar74;
            auVar64._12_4_ = fVar90 * fVar69 + fVar87 * fVar75;
          }
          else {
            lVar50 = *(long *)(lVar16 + 0x38 + lVar53);
            lVar17 = *(long *)(lVar16 + 0x48 + lVar53);
            auVar88 = *(undefined1 (*) [16])(lVar50 + lVar17 * uVar45);
            auVar91 = *(undefined1 (*) [16])(lVar50 + lVar17 * uVar49);
            auVar64 = *(undefined1 (*) [16])(lVar50 + lVar17 * uVar48);
            auVar67 = *(undefined1 (*) [16])(lVar50 + lVar17 * uVar51);
            auVar63 = minps(auVar88,auVar91);
            auVar78 = minps(auVar64,auVar67);
            auVar78 = minps(auVar63,auVar78);
            auVar88 = maxps(auVar88,auVar91);
            auVar91 = maxps(auVar64,auVar67);
            auVar63 = maxps(auVar88,auVar91);
            lVar50 = *(long *)(lVar16 + -0x38 + lVar54);
            lVar17 = *(long *)(lVar16 + -0x28 + lVar54);
            auVar88 = *(undefined1 (*) [16])(lVar50 + lVar17 * uVar45);
            auVar91 = *(undefined1 (*) [16])(lVar50 + lVar17 * uVar49);
            auVar64 = *(undefined1 (*) [16])(lVar50 + lVar17 * uVar48);
            auVar67 = *(undefined1 (*) [16])(lVar50 + lVar17 * uVar51);
            auVar72 = minps(auVar88,auVar91);
            auVar86 = minps(auVar64,auVar67);
            auVar72 = minps(auVar72,auVar86);
            auVar88 = maxps(auVar88,auVar91);
            auVar91 = maxps(auVar64,auVar67);
            auVar88 = maxps(auVar88,auVar91);
            if (fVar87 <= 0.0) {
              fVar87 = 0.0;
            }
            fVar66 = 1.0 - fVar87;
            auVar64._0_4_ = fVar89 * fVar66 + auVar78._0_4_ * fVar87;
            auVar64._4_4_ = fVar65 * fVar66 + auVar78._4_4_ * fVar87;
            auVar64._8_4_ = fVar68 * fVar66 + auVar78._8_4_ * fVar87;
            auVar64._12_4_ = fVar69 * fVar66 + auVar78._12_4_ * fVar87;
            auVar67._0_4_ = fVar66 * fVar76 + fVar87 * auVar63._0_4_;
            auVar67._4_4_ = fVar66 * fVar81 + fVar87 * auVar63._4_4_;
            auVar67._8_4_ = fVar66 * fVar84 + fVar87 * auVar63._8_4_;
            auVar67._12_4_ = fVar66 * fVar73 + fVar87 * auVar63._12_4_;
            fVar60 = fVar60 - fVar95;
            if (fVar60 <= 0.0) {
              fVar60 = 0.0;
            }
            fVar87 = 1.0 - fVar60;
            auVar63._0_4_ = fVar70 * fVar87 + auVar72._0_4_ * fVar60;
            auVar63._4_4_ = fVar71 * fVar87 + auVar72._4_4_ * fVar60;
            auVar63._8_4_ = fVar74 * fVar87 + auVar72._8_4_ * fVar60;
            auVar63._12_4_ = fVar75 * fVar87 + auVar72._12_4_ * fVar60;
            auVar78._0_4_ = fVar87 * fVar77 + fVar60 * auVar88._0_4_;
            auVar78._4_4_ = fVar87 * fVar79 + fVar60 * auVar88._4_4_;
            auVar78._8_4_ = fVar87 * fVar80 + fVar60 * auVar88._8_4_;
            auVar78._12_4_ = fVar87 * fVar82 + fVar60 * auVar88._12_4_;
            uVar46 = iVar32 + 1;
            if ((int)uVar46 < (int)uVar18) {
              plVar52 = (long *)(lVar16 + (ulong)uVar46 * 0x38 + 0x10);
              do {
                fVar71 = ((float)(int)uVar46 / fVar90 - fVar94) / (fVar96 - fVar94);
                fVar87 = 1.0 - fVar71;
                fVar60 = auVar63._4_4_;
                fVar65 = auVar63._12_4_;
                fVar81 = auVar63._8_4_;
                fVar89 = auVar64._4_4_;
                fVar95 = auVar64._12_4_;
                fVar84 = auVar64._8_4_;
                fVar74 = auVar78._4_4_;
                fVar75 = auVar78._8_4_;
                fVar76 = auVar78._12_4_;
                fVar68 = auVar67._4_4_;
                fVar69 = auVar67._8_4_;
                fVar70 = auVar67._12_4_;
                lVar50 = plVar52[-2];
                lVar16 = *plVar52;
                auVar88 = *(undefined1 (*) [16])(lVar50 + lVar16 * uVar45);
                auVar91 = *(undefined1 (*) [16])(lVar50 + lVar16 * uVar49);
                auVar72 = *(undefined1 (*) [16])(lVar50 + lVar16 * uVar48);
                auVar86 = *(undefined1 (*) [16])(lVar50 + lVar16 * uVar51);
                auVar92 = minps(auVar88,auVar91);
                auVar93 = minps(auVar72,auVar86);
                auVar92 = minps(auVar92,auVar93);
                auVar93._0_4_ = auVar92._0_4_ - (auVar64._0_4_ * fVar87 + auVar63._0_4_ * fVar71);
                auVar93._4_4_ = auVar92._4_4_ - (fVar89 * fVar87 + fVar60 * fVar71);
                auVar93._8_4_ = auVar92._8_4_ - (fVar84 * fVar87 + fVar81 * fVar71);
                auVar93._12_4_ = auVar92._12_4_ - (fVar95 * fVar87 + fVar65 * fVar71);
                auVar88 = maxps(auVar88,auVar91);
                auVar91 = maxps(auVar72,auVar86);
                auVar88 = maxps(auVar88,auVar91);
                auVar72._0_4_ = auVar88._0_4_ - (fVar87 * auVar67._0_4_ + fVar71 * auVar78._0_4_);
                auVar72._4_4_ = auVar88._4_4_ - (fVar87 * fVar68 + fVar71 * fVar74);
                auVar72._8_4_ = auVar88._8_4_ - (fVar87 * fVar69 + fVar71 * fVar75);
                auVar72._12_4_ = auVar88._12_4_ - (fVar87 * fVar70 + fVar71 * fVar76);
                auVar88 = minps(auVar93,ZEXT816(0));
                auVar64._0_4_ = auVar64._0_4_ + auVar88._0_4_;
                auVar64._4_4_ = fVar89 + auVar88._4_4_;
                auVar64._8_4_ = fVar84 + auVar88._8_4_;
                auVar64._12_4_ = fVar95 + auVar88._12_4_;
                auVar63._0_4_ = auVar63._0_4_ + auVar88._0_4_;
                auVar63._4_4_ = fVar60 + auVar88._4_4_;
                auVar63._8_4_ = fVar81 + auVar88._8_4_;
                auVar63._12_4_ = fVar65 + auVar88._12_4_;
                auVar88 = maxps(auVar72,ZEXT816(0));
                auVar67._0_4_ = auVar67._0_4_ + auVar88._0_4_;
                auVar67._4_4_ = fVar68 + auVar88._4_4_;
                auVar67._8_4_ = fVar69 + auVar88._8_4_;
                auVar67._12_4_ = fVar70 + auVar88._12_4_;
                auVar78._0_4_ = auVar78._0_4_ + auVar88._0_4_;
                auVar78._4_4_ = fVar74 + auVar88._4_4_;
                auVar78._8_4_ = fVar75 + auVar88._8_4_;
                auVar78._12_4_ = fVar76 + auVar88._12_4_;
                uVar46 = uVar46 + 1;
                plVar52 = plVar52 + 7;
              } while (uVar18 != uVar46);
            }
          }
          auVar61 = minps(auVar61,auVar64);
          auVar83 = maxps(auVar83,auVar67);
          auVar62 = minps(auVar62,auVar63);
          auVar85 = maxps(auVar85,auVar78);
          lVar58 = lVar58 + 1;
        } while (lVar58 != 4);
        local_1b78 = maxps(local_1b78,auVar85);
        local_1b88 = minps(local_1b88,auVar62);
        local_1b68._0_16_ = maxps(local_1b68._0_16_,auVar83);
        local_17e8 = minps(local_17e8,auVar61);
        lVar33 = lVar33 + 1;
      } while (lVar33 != uVar37 + (uVar37 == 0));
    }
    (__return_storage_ptr__->ref).ptr = uVar47 | (ulong)pcVar44 | 8;
    *(undefined1 (*) [16])(__return_storage_ptr__->lbounds).bounds0.lower.field_0.m128 = local_17e8;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 = local_1b68._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 + 8) =
         local_1b68._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 = local_1b88._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 + 8) =
         local_1b88._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 = local_1b78._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 + 8) =
         local_1b78._8_8_;
    __return_storage_ptr__->dt = BStack_1840;
    return __return_storage_ptr__;
  }
  lVar33 = 0xbc;
  do {
    *(undefined8 *)((long)&fStack_17d4 + lVar33) = 0xffffffff7f800000;
    *(undefined8 *)((long)&fStack_17cc + lVar33) = 0;
    lVar33 = lVar33 + 0xf0;
  } while (lVar33 != 0xfbc);
  local_848 = 1;
  local_640 = 1;
  local_1758[0] = uVar57;
  local_1758[1] = uVar45;
  local_1748[0] = values[0].ref.ptr;
  local_1748[1] = values[0]._8_8_;
  local_1738.lower = (float)values[0].lbounds.bounds0.lower.field_0._0_4_;
  local_1738.upper = (float)values[0].lbounds.bounds0.lower.field_0._4_4_;
  fStack_1730 = (float)values[0].lbounds.bounds0.lower.field_0._8_4_;
  fStack_172c = (float)values[0].lbounds.bounds0.lower.field_0._12_4_;
  local_1728[0] = BVar5;
  local_1718._0_8_ = geomID.field_0.v[0];
  local_1718._16_8_ = local_17b8._0_8_;
  local_16f8[0].lower = (float)local_17a8._0_4_;
  local_16f8[0].upper = (float)local_17a8._4_4_;
  local_16f8[1].lower = (float)local_17a8._8_4_;
  local_16f8[1].upper = (float)local_17a8._12_4_;
  local_16f8[2].lower = (float)local_1798._0_4_;
  local_16f8[2].upper = (float)local_1798._4_4_;
  local_16f8[3].lower = (float)local_1798._8_4_;
  local_16f8[3].upper = (float)local_1798._12_4_;
  local_840 = BVar5;
  local_838[0].lower = 2.8026e-45;
  local_838[0].upper = 0.0;
  local_8c8[0] = &local_840;
  local_1e28._8_8_ = 0x7f8000007f800000;
  local_1e28._0_8_ = 0x7f8000007f800000;
  local_1e38._8_8_ = 0xff800000ff800000;
  local_1e38._0_8_ = 0xff800000ff800000;
  bVar26 = false;
  geomID.field_0.v[0] = uVar37;
  local_17b8 = aVar19;
  local_17a8 = (undefined1  [16])aVar20;
  local_1798 = (undefined1  [16])aVar21;
  local_1788 = aVar22;
  local_1778 = aVar23;
  local_1768 = aVar24;
  do {
    if (local_848 == 0) {
      uVar57 = 0xffffffffffffffff;
    }
    else {
      uVar57 = 0xffffffffffffffff;
      puVar42 = local_1758;
      uVar45 = 0;
      uVar47 = 0;
      do {
        uVar49 = puVar42[1] - *puVar42;
        if ((((this->cfg).maxLeafSize < uVar49) || (1 < *(uint *)((long)puVar42 + 0x4c))) ||
           (bVar25)) {
          if (uVar45 < uVar49) {
            uVar57 = uVar47;
            uVar45 = uVar49;
          }
          bVar25 = false;
        }
        uVar47 = uVar47 + 1;
        puVar42 = puVar42 + 0x1e;
      } while (local_848 != uVar47);
    }
    if (uVar57 != 0xffffffffffffffff) {
      lVar33 = uVar57 * 0xf0;
      v0.field_0.v[0] = uVar37 + 1;
      local_1be8 = 0xffffffff7f800000;
      uStack_1be0 = 0;
      local_1a98 = 0xffffffff7f800000;
      uStack_1a90 = 0;
      pSVar3 = (Split *)(local_1718 + lVar33);
      iVar32 = *(int *)(local_1718 + lVar33 + 0xc);
      v1.field_0.v[0] = v0.field_0.v[0];
      if (iVar32 == 0) {
        sVar39 = local_1758[uVar57 * 0x1e];
        end = local_1758[uVar57 * 0x1e + 1];
        v2.field_0.v[0] = 0x7f8000007f800000;
        v2.field_0.v[1] = 0x7f8000007f800000;
        local_1d18.m128[0] = -INFINITY;
        local_1d18.m128[1] = -INFINITY;
        local_1d18.m128[2] = -INFINITY;
        local_1d18.m128[3] = -INFINITY;
        local_1d08.i[0] = (int)INFINITY;
        local_1d08.i[1] = (int)INFINITY;
        local_1d08.i[2] = (int)INFINITY;
        local_1d08.i[3] = (int)INFINITY;
        local_1cf8.i[0] = (int)-INFINITY;
        local_1cf8.i[1] = (int)-INFINITY;
        local_1cf8.i[2] = (int)-INFINITY;
        local_1cf8.i[3] = (int)-INFINITY;
        local_1ce8.m128[0] = INFINITY;
        local_1ce8.m128[1] = INFINITY;
        local_1ce8._8_8_ = 0x7f8000007f800000;
        local_1cd8._0_8_ = 0xff800000ff800000;
        local_1cd8._8_8_ = 0xff800000ff800000;
        local_1ca8 = 0.0;
        local_1cb8 = 0;
        sStack_1cb0 = 0;
        local_1cc8 = 0;
        sStack_1cc0 = 0;
        fStack_1ca4 = 1.0;
        fStack_1ca0 = 1.0;
        fStack_1c9c = 0.0;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_
             = 0x7f8000007f800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_
             = 0x7f8000007f800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_
             = 0xff800000ff800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._8_8_
             = 0xff800000ff800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._0_8_
             = 0x7f8000007f800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._8_8_
             = 0x7f8000007f800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0._0_8_
             = 0xff800000ff800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0._8_8_
             = 0xff800000ff800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._0_8_ =
             0x7f8000007f800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._8_8_ =
             0x7f8000007f800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._0_8_ =
             0xff800000ff800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._8_8_ =
             0xff800000ff800000;
        right.max_time_range.lower = 0.0;
        right.num_time_segments = 0;
        right.max_num_time_segments = 0;
        right.object_range._begin = 0;
        right.object_range._end = 0;
        right.max_time_range.upper = 1.0;
        right.time_range.lower = 1.0;
        right.time_range.upper = 0.0;
        vSplitPos.field_0.i[1] = *(undefined4 *)(local_1718 + lVar33 + 8);
        vSplitPos.field_0.i[0] = vSplitPos.field_0.i[1];
        vSplitPos.field_0.i[3] = vSplitPos.field_0.i[1];
        vSplitPos.field_0.i[2] = vSplitPos.field_0.i[1];
        lVar34 = (long)(1 << (local_1718[lVar33 + 4] & 0x1f)) * 0x10;
        vSplitMask.field_0._0_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar34);
        vSplitMask.field_0._8_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar34 + 8);
        isLeft.vSplitPos = &vSplitPos;
        isLeft.vSplitMask = &vSplitMask;
        isLeft.split = pSVar3;
        sStack_1c20 = parallel_partitioning<embree::PrimRefMB,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::EmptyTy,embree::sse2::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_,embree::sse2::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimRefMB_const&)_1_,embree::sse2::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_>
                                (*(PrimRefMB **)((long)local_1728[uVar57 * 0x1e] + 0x20),sVar39,end,
                                 (EmptyTy *)local_19f8,
                                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&v2,&right,&isLeft,
                                 &reduction,&reduction2,0x80,0xc00);
        local_1bf8 = local_1728[uVar57 * 0x1e];
        BVar5 = local_1728[uVar57 * 0x1e + -1];
        local_1c58._8_8_ = 0xff800000ff800000;
        local_1c58._0_8_ = 0xff800000ff800000;
        local_1c88._0_8_ = v2.field_0.v[0];
        local_1c88._8_8_ = v2.field_0.v[1];
        local_1c78.m128[0] = -INFINITY;
        local_1c78.m128[1] = -INFINITY;
        local_1c78.m128[2] = -INFINITY;
        local_1c78.m128[3] = -INFINITY;
        local_1c68.m128[0] = INFINITY;
        local_1c68.m128[1] = INFINITY;
        local_1c68.m128[2] = INFINITY;
        local_1c68.m128[3] = INFINITY;
        local_1c48.lower = INFINITY;
        local_1c48.upper = INFINITY;
        acStack_1c40[0] = '\0';
        acStack_1c40[1] = '\0';
        acStack_1c40[2] = -0x80;
        acStack_1c40[3] = '\x7f';
        acStack_1c40[4] = '\0';
        acStack_1c40[5] = '\0';
        acStack_1c40[6] = -0x80;
        acStack_1c40[7] = '\x7f';
        acStack_1c40[8] = '\0';
        acStack_1c40[9] = '\0';
        acStack_1c40[10] = -0x80;
        acStack_1c40[0xb] = -1;
        acStack_1c40[0xc] = '\0';
        acStack_1c40[0xd] = '\0';
        acStack_1c40[0xe] = -0x80;
        acStack_1c40[0xf] = -1;
        acStack_1c40[0x10] = '\0';
        acStack_1c40[0x11] = '\0';
        acStack_1c40[0x12] = -0x80;
        acStack_1c40[0x13] = -1;
        acStack_1c40[0x14] = '\0';
        acStack_1c40[0x15] = '\0';
        acStack_1c40[0x16] = -0x80;
        acStack_1c40[0x17] = -1;
        local_1c08.lower = 0.0;
        local_1c08.upper = 1.0;
        local_1c18 = 0;
        sStack_1c10 = 0;
        fVar87 = BVar5.lower;
        BStack_1c00.lower = 1.0;
        fVar90 = fVar87;
        if (fVar87 <= 1.0) {
          fVar90 = BStack_1c00.lower;
        }
        BStack_1c00.upper = 0.0;
        fVar89 = BVar5.upper;
        if (fVar89 <= 0.0) {
          BStack_1c00.upper = fVar89;
        }
        BStack_1c00.lower = fVar90;
        local_1b38._0_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        local_1b38._8_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _8_8_;
        local_1b28 = right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                     field_0._0_8_;
        BStack_1b20.lower =
             (float)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                    field_0._8_4_;
        BStack_1b20.upper =
             (float)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                    field_0._12_4_;
        local_1b18.lower =
             (float)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                    field_0._0_4_;
        local_1b18.upper =
             (float)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                    field_0._4_4_;
        uStack_1b10 = right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                      field_0._8_8_;
        local_1b08 = right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                     field_0._0_8_;
        uStack_1b00 = right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                      field_0._8_8_;
        local_1af8._8_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._8_8_;
        local_1af8._0_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._0_8_;
        local_1ae8._8_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._8_8_;
        local_1ae8._0_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._0_8_;
        local_1ab8.lower = right.max_time_range.lower;
        BStack_1ab0.lower = right.time_range.lower;
        local_1ac8 = right.num_time_segments;
        sStack_1ac0 = right.max_num_time_segments;
        if (fVar87 <= BStack_1ab0.lower) {
          BVar5 = (BBox1f)((ulong)BStack_1ab0 & 0xffffffff);
        }
        if (fVar89 <= BStack_1ab0.upper) {
          BStack_1ab0.upper = fVar89;
        }
        BStack_1ab0.lower = BVar5.lower;
        local_1c28 = sVar39;
        local_1ad8 = sStack_1c20;
        sStack_1ad0 = end;
        local_1aa8 = local_1bf8;
LAB_00d3c018:
        new_vector._M_t.
        super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        .
        super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
              )(__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                )0x0;
      }
      else {
        this_00 = &local_17b8 + uVar57 * 0xf;
        if (iVar32 != 2) {
          if (iVar32 == 1) {
            SetMB::deterministic_order((SetMB *)&this_00->field_1);
            splitFallback(this,(SetMB *)&this_00->field_1,(SetMB *)&local_1c88.field_1,
                          (SetMB *)&local_1b38.field_1);
          }
          else if (iVar32 == 3) {
            SetMB::deterministic_order((SetMB *)&this_00->field_1);
            splitByGeometry(this,(SetMB *)&this_00->field_1,(SetMB *)&local_1c88.field_1,
                            (SetMB *)&local_1b38.field_1);
          }
          goto LAB_00d3c018;
        }
        time_range1.lower = *(float *)(local_1718 + lVar33 + 8);
        time_range0.lower = local_1728[uVar57 * 0x1e + -1].lower;
        time_range1.upper = local_1728[uVar57 * 0x1e + -1].upper;
        BVar5 = local_1728[uVar57 * 0x1e];
        time_range0.upper = time_range1.lower;
        BVar35 = (BBox1f)operator_new(0x28);
        pMVar6 = (this->heuristicTemporalSplit).device;
        uVar45 = local_1758[uVar57 * 0x1e + 1];
        *(MemoryMonitorInterface **)BVar35 = pMVar6;
        *(undefined1 *)((long)BVar35 + 8) = 0;
        *(long *)((long)BVar35 + 0x10) = 0;
        *(long *)((long)BVar35 + 0x18) = 0;
        *(long *)((long)BVar35 + 0x20) = 0;
        lVar34 = uVar45 - local_1758[uVar57 * 0x1e];
        if (lVar34 != 0) {
          uVar45 = lVar34 * 0x50;
          (**pMVar6->_vptr_MemoryMonitorInterface)(pMVar6,uVar45,0);
          if (uVar45 < 0x1c00000) {
            pvVar36 = alignedMalloc(uVar45,0x10);
          }
          else {
            pvVar36 = os_malloc(uVar45,(bool *)((long)BVar35 + 8));
          }
          *(void **)((long)BVar35 + 0x20) = pvVar36;
          *(long *)((long)BVar35 + 0x10) = lVar34;
          *(long *)((long)BVar35 + 0x18) = lVar34;
        }
        pvVar29 = isLeft.vSplitPos;
        vSplitMask.field_0._8_8_ = &time_range0;
        pSVar7 = (Split *)local_1758[uVar57 * 0x1e];
        pvVar8 = (vint *)local_1758[uVar57 * 0x1e + 1];
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_
             = 0x7f8000007f800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_
             = 0x7f8000007f800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_
             = 0xff800000ff800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._8_8_
             = 0xff800000ff800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._0_8_
             = 0x7f8000007f800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._8_8_
             = 0x7f8000007f800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0._0_8_
             = 0xff800000ff800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0._8_8_
             = 0xff800000ff800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._0_8_ =
             0x7f8000007f800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._8_8_ =
             0x7f8000007f800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._0_8_ =
             0xff800000ff800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._8_8_ =
             0xff800000ff800000;
        right.max_time_range.lower = 0.0;
        right.num_time_segments = 0;
        right.max_num_time_segments = 0;
        right.object_range._begin = 0;
        right.object_range._end = 0;
        right.max_time_range.upper = 1.0;
        right.time_range.lower = 1.0;
        right.time_range.upper = 0.0;
        new_vector._M_t.
        super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        .
        super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
              )(__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
                )BVar35;
        vSplitMask.field_0._0_8_ = BVar5;
        if ((ulong)((long)pvVar8 - (long)pSVar7) < 0xc00) {
          isLeft.split = pSVar7;
          isLeft.vSplitPos = pvVar8;
          ::anon_func::anon_class_40_5_808acc65::operator()
                    ((PrimInfoMB *)&v2,(anon_class_40_5_808acc65 *)&vSplitMask,
                     (range<unsigned_long> *)&isLeft);
        }
        else {
          isLeft.vSplitPos._6_2_ = SUB82(pvVar29,6);
          isLeft.vSplitPos._0_6_ = CONCAT15(4,CONCAT14(1,isLeft.vSplitPos._0_4_));
          tbb::detail::r1::initialize((task_group_context *)&isLeft);
          _reduction = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
          vSplitPos.field_0.v[0] = (longlong)pvVar8;
          vSplitPos.field_0.v[1] = (longlong)pSVar7;
          tbb::detail::d1::
          parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::QuadMesh>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::QuadMesh>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                    ((PrimInfoMB *)&v2,(d1 *)&vSplitPos,(blocked_range<unsigned_long> *)&right,
                     (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&reduction,
                     (anon_class_16_2_ed117de8_conflict29 *)
                     PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                     (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                      *)&isLeft,in_stack_ffffffffffffe168);
          cVar31 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&isLeft);
          if (cVar31 != '\0') {
            prVar41 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar41,"task cancelled");
            __cxa_throw(prVar41,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          tbb::detail::r1::destroy((task_group_context *)&isLeft);
        }
        if (sStack_1cc0 - local_1cc8 != local_1758[uVar57 * 0x1e + 1] - local_1758[uVar57 * 0x1e]) {
          right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
          _0_8_ = &time_range0;
          sStack_1cc0 = parallel_filter<embree::PrimRefMB,unsigned_long,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::QuadMesh>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_>
                                  (*(PrimRefMB **)((long)BVar35 + 0x20),0,
                                   local_1758[uVar57 * 0x1e + 1] - local_1758[uVar57 * 0x1e],0x400,
                                   (anon_class_8_1_41ce32a5 *)&right);
        }
        uVar30 = vSplitPos.field_0.v[1];
        local_1c18 = local_1cb8;
        sStack_1c10 = sStack_1cb0;
        local_1c88._0_8_ = v2.field_0.v[0];
        local_1c88._8_8_ = v2.field_0.v[1];
        local_1c78._0_8_ = local_1d18._0_8_;
        local_1c78._8_8_ = local_1d18._8_8_;
        local_1c68._0_8_ = local_1d08._0_8_;
        local_1c68._8_8_ = local_1d08._8_8_;
        local_1c58._8_8_ = local_1cf8._8_8_;
        local_1c58._0_8_ = local_1cf8._0_8_;
        local_1c48.lower = local_1ce8.m128[0];
        local_1c48.upper = local_1ce8.m128[1];
        acStack_1c40[0] = local_1ce8._8_1_;
        acStack_1c40[1] = local_1ce8._9_1_;
        acStack_1c40[2] = local_1ce8._10_1_;
        acStack_1c40[3] = local_1ce8._11_1_;
        acStack_1c40[4] = local_1ce8._12_1_;
        acStack_1c40[5] = local_1ce8._13_1_;
        acStack_1c40[6] = local_1ce8._14_1_;
        acStack_1c40[7] = local_1ce8._15_1_;
        acStack_1c40[8] = local_1cd8._0_1_;
        acStack_1c40[9] = local_1cd8._1_1_;
        acStack_1c40[10] = local_1cd8._2_1_;
        acStack_1c40[0xb] = local_1cd8._3_1_;
        acStack_1c40[0xc] = local_1cd8._4_1_;
        acStack_1c40[0xd] = local_1cd8._5_1_;
        acStack_1c40[0xe] = local_1cd8._6_1_;
        acStack_1c40[0xf] = local_1cd8._7_1_;
        acStack_1c40[0x10] = local_1cd8._8_1_;
        acStack_1c40[0x11] = local_1cd8._9_1_;
        acStack_1c40[0x12] = local_1cd8._10_1_;
        acStack_1c40[0x13] = local_1cd8._11_1_;
        acStack_1c40[0x14] = local_1cd8._12_1_;
        acStack_1c40[0x15] = local_1cd8._13_1_;
        acStack_1c40[0x16] = local_1cd8._14_1_;
        acStack_1c40[0x17] = local_1cd8._15_1_;
        local_1c28 = local_1cc8;
        sStack_1c20 = sStack_1cc0;
        local_1c08.upper = fStack_1ca4;
        local_1c08.lower = local_1ca8;
        BStack_1c00 = (BBox1f)(CONCAT44(~-(uint)(fStack_1c9c < time_range0.upper) &
                                        (uint)time_range0.upper,
                                        ~-(uint)(fStack_1ca0 < time_range0.lower) &
                                        (uint)fStack_1ca0) |
                              CONCAT44((uint)fStack_1c9c & -(uint)(fStack_1c9c < time_range0.upper),
                                       (uint)time_range0.lower &
                                       -(uint)(fStack_1ca0 < time_range0.lower)));
        pcVar9 = (code *)local_1758[uVar57 * 0x1e + 1];
        isLeft.split = (Split *)0x7f8000007f800000;
        isLeft.vSplitPos = (vint *)0x7f8000007f800000;
        isLeft.vSplitMask = (vbool *)0xff800000ff800000;
        local_1bf8 = BVar35;
        _reduction2 = BVar5;
        if ((long)pcVar9 - local_1758[uVar57 * 0x1e] < 0xc00) {
          vSplitPos.field_0.v[0] = local_1758[uVar57 * 0x1e];
          vSplitPos.field_0.v[1] = (longlong)pcVar9;
          ::anon_func::anon_class_24_3_35f68c7c::operator()
                    (&right,(anon_class_24_3_35f68c7c *)&reduction2,
                     (range<unsigned_long> *)&vSplitPos);
        }
        else {
          vSplitPos.field_0.v[1]._4_1_ = 1;
          vSplitPos.field_0.v[1]._6_2_ = SUB82(uVar30,6);
          vSplitPos.field_0.v[1]._5_1_ = 4;
          tbb::detail::r1::initialize((task_group_context *)&vSplitPos);
          local_19f8._0_8_ = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
          local_19f8._8_8_ = &reduction2;
          _reduction = pcVar9;
          tbb::detail::d1::
          parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::QuadMesh>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::QuadMesh>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                    (&right,(d1 *)&reduction,(blocked_range<unsigned_long> *)&isLeft,
                     (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)local_19f8,
                     (anon_class_16_2_ed117de8_conflict30 *)
                     PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                     (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                      *)&vSplitPos,in_stack_ffffffffffffe168);
          cVar31 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&vSplitPos);
          if (cVar31 != '\0') {
            prVar41 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar41,"task cancelled");
            __cxa_throw(prVar41,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          tbb::detail::r1::destroy((task_group_context *)&vSplitPos);
        }
        lVar34 = right.object_range._end - right.object_range._begin;
        right.object_range._begin = local_1758[uVar57 * 0x1e];
        right.object_range._end = lVar34 + right.object_range._begin;
        if (lVar34 != local_1758[uVar57 * 0x1e + 1] - right.object_range._begin) {
          isLeft.split = (Split *)&time_range1;
          right.object_range._end =
               parallel_filter<embree::PrimRefMB,unsigned_long,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::QuadMesh>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_2_>
                         (*(PrimRefMB **)((long)BVar5 + 0x20),right.object_range._begin,
                          local_1758[uVar57 * 0x1e + 1],0x400,(anon_class_8_1_41ce32a6 *)&isLeft);
        }
        local_1b38._0_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        local_1b38._8_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _8_8_;
        local_1b28 = right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                     field_0._0_8_;
        BStack_1b20.lower =
             (float)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                    field_0._8_4_;
        BStack_1b20.upper =
             (float)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                    field_0._12_4_;
        local_1b18.lower =
             (float)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                    field_0._0_4_;
        local_1b18.upper =
             (float)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                    field_0._4_4_;
        uStack_1b10 = right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                      field_0._8_8_;
        local_1b08 = right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                     field_0._0_8_;
        uStack_1b00 = right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                      field_0._8_8_;
        local_1af8._8_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._8_8_;
        local_1af8._0_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._0_8_;
        local_1ae8._8_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._8_8_;
        local_1ae8._0_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._0_8_;
        sStack_1ac0 = right.max_num_time_segments;
        local_1ac8 = right.num_time_segments;
        local_1ad8 = right.object_range._begin;
        sStack_1ad0 = right.object_range._end;
        local_1ab8.upper = right.max_time_range.upper;
        local_1ab8.lower = right.max_time_range.lower;
        BStack_1ab0 = (BBox1f)(CONCAT44(~-(uint)(right.time_range.upper < time_range1.upper) &
                                        (uint)time_range1.upper,
                                        ~-(uint)(right.time_range.lower < time_range1.lower) &
                                        (uint)right.time_range.lower) |
                              CONCAT44((uint)right.time_range.upper &
                                       -(uint)(right.time_range.upper < time_range1.upper),
                                       (uint)time_range1.lower &
                                       -(uint)(right.time_range.lower < time_range1.lower)));
        local_1aa8 = BVar5;
      }
      bVar59 = (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                )new_vector._M_t.
                 super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                 .
                 super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                 ._M_head_impl !=
               (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                )0x0;
      findFallback((Split *)&v2,this,(SetMB *)&local_1c88.field_1);
      local_1bd8.lower = local_1d18.m128[0];
      local_1bd8.upper = local_1d18.m128[1];
      local_1bc8.lower = (float)local_1d08.i[0];
      local_1bc8.upper = (float)local_1d08.i[1];
      BStack_1bc0.lower = (float)local_1d08.i[2];
      BStack_1bc0.upper = (float)local_1d08.i[3];
      local_1bb8.lower = (float)local_1cf8.i[0];
      local_1bb8.upper = (float)local_1cf8.i[1];
      BStack_1bb0.lower = (float)local_1cf8.i[2];
      BStack_1bb0.upper = (float)local_1cf8.i[3];
      findFallback((Split *)&v2,this,(SetMB *)&local_1b38.field_1);
      lVar34 = local_640;
      local_1a88.lower = local_1d18.m128[0];
      local_1a88.upper = local_1d18.m128[1];
      local_1a78.lower = (float)local_1d08.i[0];
      local_1a78.upper = (float)local_1d08.i[1];
      BStack_1a70.lower = (float)local_1d08.i[2];
      BStack_1a70.upper = (float)local_1d08.i[3];
      local_1a68.lower = (float)local_1cf8.i[0];
      local_1a68.upper = (float)local_1cf8.i[1];
      BStack_1a60.lower = (float)local_1cf8.i[2];
      BStack_1a60.upper = (float)local_1cf8.i[3];
      new_vector._M_t.
      super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      .
      super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
            )(__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
              )0x0;
      pBVar55 = local_8c8[uVar57];
      if (local_1bf8 == *pBVar55) {
        pBVar55[1] = (BBox1f)((long)pBVar55[1] + 1);
      }
      else {
        local_640 = local_640 + 1;
        local_838[lVar34 * 2 + -1] = local_1bf8;
        local_838[lVar34 * 2].lower = 1.4013e-45;
        local_838[lVar34 * 2].upper = 0.0;
        local_8c8[uVar57] = local_838 + lVar34 * 2 + -1;
      }
      lVar34 = local_640;
      if (local_1aa8 == *pBVar55) {
        local_8c8[local_848] = pBVar55;
        pBVar55[1] = (BBox1f)((long)pBVar55[1] + 1);
      }
      else {
        local_640 = local_640 + 1;
        local_838[lVar34 * 2 + -1] = local_1aa8;
        local_838[lVar34 * 2].lower = 1.4013e-45;
        local_838[lVar34 * 2].upper = 0.0;
        local_8c8[local_848] = local_838 + lVar34 * 2 + -1;
      }
      pBVar12 = pBVar55 + 1;
      *pBVar12 = (BBox1f)((long)*pBVar12 + -1);
      if ((*pBVar12 == (BBox1f)0x0) && (BVar5 = *pBVar55, BVar5 != (BBox1f)0x0)) {
        lVar34 = *(long *)((long)BVar5 + 0x18);
        pvVar36 = *(void **)((long)BVar5 + 0x20);
        if (pvVar36 != (void *)0x0) {
          if ((ulong)(lVar34 * 0x50) < 0x1c00000) {
            alignedFree(pvVar36);
          }
          else {
            os_free(pvVar36,lVar34 * 0x50,*(bool *)((long)BVar5 + 8));
          }
        }
        if (lVar34 != 0) {
          (**(code **)**(undefined8 **)BVar5)(*(undefined8 **)BVar5,lVar34 * -0x50,1);
        }
        *(undefined8 *)((long)BVar5 + 0x10) = 0;
        *(undefined8 *)((long)BVar5 + 0x18) = 0;
        *(undefined8 *)((long)BVar5 + 0x20) = 0;
        operator_delete((void *)BVar5);
      }
      uVar45 = local_848;
      (&geomID)[uVar57 * 0xf].field_0.v[0] = v0.field_0.v[0];
      *(undefined8 *)(&local_17b8 + uVar57 * 0xf) = local_1c88._0_8_;
      *(undefined8 *)((long)&local_17b8 + lVar33 + 8) = local_1c88._8_8_;
      ((BBox1f *)(local_17a8 + lVar33))->lower = (float)local_1c78._0_4_;
      ((BBox1f *)(local_17a8 + lVar33))->upper = local_1c78.m128[1];
      ((BBox1f *)(local_17a8 + lVar33 + 8))->lower = (float)local_1c78._8_4_;
      ((BBox1f *)(local_17a8 + lVar33 + 8))->upper = local_1c78.m128[3];
      ((BBox1f *)(local_1798 + lVar33))->lower = (float)local_1c68._0_4_;
      ((BBox1f *)(local_1798 + lVar33))->upper = local_1c68.m128[1];
      ((BBox1f *)(local_1798 + lVar33 + 8))->lower = (float)local_1c68._8_4_;
      ((BBox1f *)(local_1798 + lVar33 + 8))->upper = local_1c68.m128[3];
      *(undefined8 *)(&local_1788 + uVar57 * 0xf) = local_1c58._0_8_;
      *(undefined8 *)((long)&local_1788 + lVar33 + 8) = local_1c58._8_8_;
      *(BBox1f *)((long)&local_1778 + uVar57 * 0xf0) = local_1c48;
      *(undefined8 *)((long)&local_1778 + lVar33 + 8U) = acStack_1c40._0_8_;
      *(undefined8 *)(&local_1768 + uVar57 * 0xf) = acStack_1c40._8_8_;
      *(undefined8 *)((long)&local_1768 + lVar33 + 8) = acStack_1c40._16_8_;
      local_1758[uVar57 * 0x1e] = local_1c28;
      local_1758[uVar57 * 0x1e + 1] = sStack_1c20;
      local_1748[uVar57 * 0x1e] = local_1c18;
      local_1748[uVar57 * 0x1e + 1] = sStack_1c10;
      (&local_1738)[uVar57 * 0x1e] = local_1c08;
      local_1728[uVar57 * 0x1e + -1] = BStack_1c00;
      local_1728[uVar57 * 0x1e] = local_1bf8;
      pSVar3->sah = (float)(undefined4)local_1be8;
      pSVar3->dim = local_1be8._4_4_;
      *(undefined8 *)(local_1718 + lVar33 + 8) = uStack_1be0;
      *(BBox1f *)(local_1718 + uVar57 * 0xf0 + 0x10) = local_1bd8;
      local_16f8[uVar57 * 0x1e] = local_1bc8;
      local_16f8[uVar57 * 0x1e + 1] = BStack_1bc0;
      local_16f8[uVar57 * 0x1e + 2] = local_1bb8;
      local_16f8[uVar57 * 0x1e + 3] = BStack_1bb0;
      lVar33 = local_848 * 0xf0;
      (&geomID)[local_848 * 0xf].field_0.v[0] = v1.field_0.v[0];
      *(undefined8 *)(&local_17b8 + uVar45 * 0xf) = local_1b38._0_8_;
      *(undefined8 *)((long)&local_17b8 + lVar33 + 8) = local_1b38._8_8_;
      *(size_t *)(local_17a8 + lVar33) = local_1b28;
      *(BBox1f *)(local_17a8 + lVar33 + 8) = BStack_1b20;
      *(BBox1f *)(local_1798 + lVar33) = local_1b18;
      *(undefined8 *)(local_1798 + lVar33 + 8) = uStack_1b10;
      *(undefined8 *)(&local_1788 + uVar45 * 0xf) = local_1b08;
      *(undefined8 *)((long)&local_1788 + lVar33 + 8) = uStack_1b00;
      *(undefined8 *)((long)&local_1778 + uVar45 * 0xf0) = local_1af8._0_8_;
      *(undefined8 *)((long)&local_1778 + lVar33 + 8U) = local_1af8._8_8_;
      *(undefined8 *)(&local_1768 + uVar45 * 0xf) = local_1ae8._0_8_;
      *(undefined8 *)((long)&local_1768 + lVar33 + 8) = local_1ae8._8_8_;
      local_1758[uVar45 * 0x1e] = local_1ad8;
      local_1758[uVar45 * 0x1e + 1] = sStack_1ad0;
      local_1748[uVar45 * 0x1e] = local_1ac8;
      local_1748[uVar45 * 0x1e + 1] = sStack_1ac0;
      (&local_1738)[uVar45 * 0x1e] = local_1ab8;
      local_1728[uVar45 * 0x1e + -1] = BStack_1ab0;
      local_1728[uVar45 * 0x1e] = local_1aa8;
      *(undefined8 *)(local_1718 + lVar33) = local_1a98;
      *(undefined8 *)(local_1718 + lVar33 + 8) = uStack_1a90;
      *(BBox1f *)(local_1718 + uVar45 * 0xf0 + 0x10) = local_1a88;
      local_16f8[uVar45 * 0x1e] = local_1a78;
      local_16f8[uVar45 * 0x1e + 1] = BStack_1a70;
      local_16f8[uVar45 * 0x1e + 2] = local_1a68;
      local_16f8[uVar45 * 0x1e + 3] = BStack_1a60;
      local_848 = local_848 + 1;
      if ((__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
           )new_vector._M_t.
            super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            .
            super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
           )0x0) {
        std::
        default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
        ::operator()((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
                      *)&new_vector,
                     (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
                      *)new_vector._M_t.
                        super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                        .
                        super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                        ._M_head_impl);
      }
      bVar26 = (bool)(bVar26 | bVar59);
    }
  } while ((uVar57 != 0xffffffffffffffff) && (local_848 < (this->cfg).branchingFactor));
  if (local_848 != 0) {
    pfVar38 = &fStack_172c;
    uVar37 = local_848;
    do {
      bVar26 = (bool)(bVar26 | (*pfVar38 < (in->prims).super_PrimInfoMB.time_range.upper ||
                               (in->prims).super_PrimInfoMB.time_range.lower < pfVar38[-1]));
      pfVar38 = pfVar38 + 0x3c;
      uVar37 = uVar37 - 1;
    } while (uVar37 != 0);
  }
  if (!bVar26) {
    right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
         0xe0;
    pTVar10 = (alloc.talloc0)->parent;
    if (alloc.alloc != (pTVar10->alloc)._M_b._M_p) {
      v1.field_0.v[1]._0_1_ = 1;
      v1.field_0.v[0] = (longlong)pTVar10;
      MutexSys::lock(&pTVar10->mutex);
      if ((pTVar10->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar1 = &((pTVar10->alloc)._M_b._M_p)->bytesUsed;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (pTVar10->alloc1).bytesUsed + (pTVar10->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar1 = &((pTVar10->alloc)._M_b._M_p)->bytesFree;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (((pTVar10->alloc0).end + (pTVar10->alloc1).end) -
             ((pTVar10->alloc0).cur + (pTVar10->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar1 = &((pTVar10->alloc)._M_b._M_p)->bytesWasted;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (pTVar10->alloc1).bytesWasted + (pTVar10->alloc0).bytesWasted;
        UNLOCK();
      }
      (pTVar10->alloc0).bytesUsed = 0;
      (pTVar10->alloc0).bytesWasted = 0;
      (pTVar10->alloc0).end = 0;
      (pTVar10->alloc0).allocBlockSize = 0;
      (pTVar10->alloc0).ptr = (char *)0x0;
      (pTVar10->alloc0).cur = 0;
      if (alloc.alloc == (FastAllocator *)0x0) {
        (pTVar10->alloc1).bytesUsed = 0;
        (pTVar10->alloc1).bytesWasted = 0;
        (pTVar10->alloc1).end = 0;
        (pTVar10->alloc1).allocBlockSize = 0;
        (pTVar10->alloc1).ptr = (char *)0x0;
        (pTVar10->alloc1).cur = 0;
      }
      else {
        (pTVar10->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
        (pTVar10->alloc1).ptr = (char *)0x0;
        (pTVar10->alloc1).cur = 0;
        (pTVar10->alloc1).end = 0;
        (pTVar10->alloc1).allocBlockSize = 0;
        (pTVar10->alloc1).bytesUsed = 0;
        (pTVar10->alloc1).bytesWasted = 0;
        (pTVar10->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (pTVar10->alloc)._M_b._M_p = alloc.alloc;
      UNLOCK();
      v0.field_0.v[0] = (longlong)&FastAllocator::s_thread_local_allocators_lock;
      v0.field_0.v[1]._0_1_ = 1;
      v2.field_0.v[0] = (longlong)pTVar10;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      iVar11._M_current =
           ((alloc.alloc)->thread_local_allocators).
           super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar11._M_current ==
          ((alloc.alloc)->thread_local_allocators).
          super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
        ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                  ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                    *)&(alloc.alloc)->thread_local_allocators,iVar11,(ThreadLocal2 **)&v2);
      }
      else {
        *iVar11._M_current = (ThreadLocal2 *)v2.field_0.v[0];
        pppTVar2 = &((alloc.alloc)->thread_local_allocators).
                    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar2 = *pppTVar2 + 1;
      }
      if (v0.field_0.v[1]._0_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)v0.field_0.v[0]);
      }
      if (v1.field_0.v[1]._0_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)v1.field_0.v[0]);
      }
    }
    (alloc.talloc0)->bytesUsed =
         (alloc.talloc0)->bytesUsed +
         right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_
    ;
    sVar39 = (alloc.talloc0)->cur;
    uVar37 = (ulong)(-(int)sVar39 & 0xf);
    uVar57 = sVar39 + right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                      field_0._0_8_ + uVar37;
    (alloc.talloc0)->cur = uVar57;
    if ((alloc.talloc0)->end < uVar57) {
      (alloc.talloc0)->cur = sVar39;
      if ((alloc.talloc0)->allocBlockSize <
          (ulong)(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                  field_0._0_8_ << 2)) {
        pcVar44 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&right);
      }
      else {
        v0.field_0.v[0] = (alloc.talloc0)->allocBlockSize;
        pcVar44 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&v0);
        (alloc.talloc0)->ptr = pcVar44;
        sVar39 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar39;
        (alloc.talloc0)->cur = 0;
        (alloc.talloc0)->end = v0.field_0.v[0];
        (alloc.talloc0)->cur =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        if ((ulong)v0.field_0.v[0] <
            (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                   field_0._0_8_) {
          (alloc.talloc0)->cur = 0;
          v0.field_0.v[0] = (alloc.talloc0)->allocBlockSize;
          pcVar44 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&v0);
          (alloc.talloc0)->ptr = pcVar44;
          sVar39 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
          (alloc.talloc0)->bytesWasted = sVar39;
          (alloc.talloc0)->cur = 0;
          (alloc.talloc0)->end = v0.field_0.v[0];
          (alloc.talloc0)->cur =
               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0
               ._0_8_;
          if ((ulong)v0.field_0.v[0] <
              (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                     field_0._0_8_) {
            (alloc.talloc0)->cur = 0;
            pcVar44 = (char *)0x0;
            goto LAB_00d3d170;
          }
        }
        (alloc.talloc0)->bytesWasted = sVar39;
      }
    }
    else {
      (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar37;
      pcVar44 = (alloc.talloc0)->ptr +
                (uVar57 - right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                          lower.field_0._0_8_);
    }
LAB_00d3d170:
    pcVar44[0x60] = '\0';
    pcVar44[0x61] = '\0';
    pcVar44[0x62] = -0x80;
    pcVar44[99] = '\x7f';
    pcVar44[100] = '\0';
    pcVar44[0x65] = '\0';
    pcVar44[0x66] = -0x80;
    pcVar44[0x67] = '\x7f';
    pcVar44[0x68] = '\0';
    pcVar44[0x69] = '\0';
    pcVar44[0x6a] = -0x80;
    pcVar44[0x6b] = '\x7f';
    pcVar44[0x6c] = '\0';
    pcVar44[0x6d] = '\0';
    pcVar44[0x6e] = -0x80;
    pcVar44[0x6f] = '\x7f';
    pcVar44[0x40] = '\0';
    pcVar44[0x41] = '\0';
    pcVar44[0x42] = -0x80;
    pcVar44[0x43] = '\x7f';
    pcVar44[0x44] = '\0';
    pcVar44[0x45] = '\0';
    pcVar44[0x46] = -0x80;
    pcVar44[0x47] = '\x7f';
    pcVar44[0x48] = '\0';
    pcVar44[0x49] = '\0';
    pcVar44[0x4a] = -0x80;
    pcVar44[0x4b] = '\x7f';
    pcVar44[0x4c] = '\0';
    pcVar44[0x4d] = '\0';
    pcVar44[0x4e] = -0x80;
    pcVar44[0x4f] = '\x7f';
    pcVar44[0x20] = '\0';
    pcVar44[0x21] = '\0';
    pcVar44[0x22] = -0x80;
    pcVar44[0x23] = '\x7f';
    pcVar44[0x24] = '\0';
    pcVar44[0x25] = '\0';
    pcVar44[0x26] = -0x80;
    pcVar44[0x27] = '\x7f';
    pcVar44[0x28] = '\0';
    pcVar44[0x29] = '\0';
    pcVar44[0x2a] = -0x80;
    pcVar44[0x2b] = '\x7f';
    pcVar44[0x2c] = '\0';
    pcVar44[0x2d] = '\0';
    pcVar44[0x2e] = -0x80;
    pcVar44[0x2f] = '\x7f';
    pcVar44[0x70] = '\0';
    pcVar44[0x71] = '\0';
    pcVar44[0x72] = -0x80;
    pcVar44[0x73] = -1;
    pcVar44[0x74] = '\0';
    pcVar44[0x75] = '\0';
    pcVar44[0x76] = -0x80;
    pcVar44[0x77] = -1;
    pcVar44[0x78] = '\0';
    pcVar44[0x79] = '\0';
    pcVar44[0x7a] = -0x80;
    pcVar44[0x7b] = -1;
    pcVar44[0x7c] = '\0';
    pcVar44[0x7d] = '\0';
    pcVar44[0x7e] = -0x80;
    pcVar44[0x7f] = -1;
    pcVar44[0x50] = '\0';
    pcVar44[0x51] = '\0';
    pcVar44[0x52] = -0x80;
    pcVar44[0x53] = -1;
    pcVar44[0x54] = '\0';
    pcVar44[0x55] = '\0';
    pcVar44[0x56] = -0x80;
    pcVar44[0x57] = -1;
    pcVar44[0x58] = '\0';
    pcVar44[0x59] = '\0';
    pcVar44[0x5a] = -0x80;
    pcVar44[0x5b] = -1;
    pcVar44[0x5c] = '\0';
    pcVar44[0x5d] = '\0';
    pcVar44[0x5e] = -0x80;
    pcVar44[0x5f] = -1;
    pcVar44[0x30] = '\0';
    pcVar44[0x31] = '\0';
    pcVar44[0x32] = -0x80;
    pcVar44[0x33] = -1;
    pcVar44[0x34] = '\0';
    pcVar44[0x35] = '\0';
    pcVar44[0x36] = -0x80;
    pcVar44[0x37] = -1;
    pcVar44[0x38] = '\0';
    pcVar44[0x39] = '\0';
    pcVar44[0x3a] = -0x80;
    pcVar44[0x3b] = -1;
    pcVar44[0x3c] = '\0';
    pcVar44[0x3d] = '\0';
    pcVar44[0x3e] = -0x80;
    pcVar44[0x3f] = -1;
    pcVar44[0x80] = '\0';
    pcVar44[0x81] = '\0';
    pcVar44[0x82] = '\0';
    pcVar44[0x83] = '\0';
    pcVar44[0x84] = '\0';
    pcVar44[0x85] = '\0';
    pcVar44[0x86] = '\0';
    pcVar44[0x87] = '\0';
    pcVar44[0x88] = '\0';
    pcVar44[0x89] = '\0';
    pcVar44[0x8a] = '\0';
    pcVar44[0x8b] = '\0';
    pcVar44[0x8c] = '\0';
    pcVar44[0x8d] = '\0';
    pcVar44[0x8e] = '\0';
    pcVar44[0x8f] = '\0';
    pcVar44[0x90] = '\0';
    pcVar44[0x91] = '\0';
    pcVar44[0x92] = '\0';
    pcVar44[0x93] = '\0';
    pcVar44[0x94] = '\0';
    pcVar44[0x95] = '\0';
    pcVar44[0x96] = '\0';
    pcVar44[0x97] = '\0';
    pcVar44[0x98] = '\0';
    pcVar44[0x99] = '\0';
    pcVar44[0x9a] = '\0';
    pcVar44[0x9b] = '\0';
    pcVar44[0x9c] = '\0';
    pcVar44[0x9d] = '\0';
    pcVar44[0x9e] = '\0';
    pcVar44[0x9f] = '\0';
    pcVar44[0xa0] = '\0';
    pcVar44[0xa1] = '\0';
    pcVar44[0xa2] = '\0';
    pcVar44[0xa3] = '\0';
    pcVar44[0xa4] = '\0';
    pcVar44[0xa5] = '\0';
    pcVar44[0xa6] = '\0';
    pcVar44[0xa7] = '\0';
    pcVar44[0xa8] = '\0';
    pcVar44[0xa9] = '\0';
    pcVar44[0xaa] = '\0';
    pcVar44[0xab] = '\0';
    pcVar44[0xac] = '\0';
    pcVar44[0xad] = '\0';
    pcVar44[0xae] = '\0';
    pcVar44[0xaf] = '\0';
    pcVar44[0xb0] = '\0';
    pcVar44[0xb1] = '\0';
    pcVar44[0xb2] = '\0';
    pcVar44[0xb3] = '\0';
    pcVar44[0xb4] = '\0';
    pcVar44[0xb5] = '\0';
    pcVar44[0xb6] = '\0';
    pcVar44[0xb7] = '\0';
    pcVar44[0xb8] = '\0';
    pcVar44[0xb9] = '\0';
    pcVar44[0xba] = '\0';
    pcVar44[0xbb] = '\0';
    pcVar44[0xbc] = '\0';
    pcVar44[0xbd] = '\0';
    pcVar44[0xbe] = '\0';
    pcVar44[0xbf] = '\0';
    pcVar44[0xc0] = '\0';
    pcVar44[0xc1] = '\0';
    pcVar44[0xc2] = '\0';
    pcVar44[0xc3] = '\0';
    pcVar44[0xc4] = '\0';
    pcVar44[0xc5] = '\0';
    pcVar44[0xc6] = '\0';
    pcVar44[199] = '\0';
    pcVar44[200] = '\0';
    pcVar44[0xc9] = '\0';
    pcVar44[0xca] = '\0';
    pcVar44[0xcb] = '\0';
    pcVar44[0xcc] = '\0';
    pcVar44[0xcd] = '\0';
    pcVar44[0xce] = '\0';
    pcVar44[0xcf] = '\0';
    pcVar44[0xd0] = '\0';
    pcVar44[0xd1] = '\0';
    pcVar44[0xd2] = '\0';
    pcVar44[0xd3] = '\0';
    pcVar44[0xd4] = '\0';
    pcVar44[0xd5] = '\0';
    pcVar44[0xd6] = '\0';
    pcVar44[0xd7] = '\0';
    pcVar44[0xd8] = '\0';
    pcVar44[0xd9] = '\0';
    pcVar44[0xda] = '\0';
    pcVar44[0xdb] = '\0';
    pcVar44[0xdc] = '\0';
    pcVar44[0xdd] = '\0';
    pcVar44[0xde] = '\0';
    pcVar44[0xdf] = '\0';
    lVar33 = 0;
    do {
      pcVar4 = pcVar44 + lVar33 * 8;
      pcVar4[0] = '\b';
      pcVar4[1] = '\0';
      pcVar4[2] = '\0';
      pcVar4[3] = '\0';
      pcVar4[4] = '\0';
      pcVar4[5] = '\0';
      pcVar4[6] = '\0';
      pcVar4[7] = '\0';
      pcVar4[8] = '\b';
      pcVar4[9] = '\0';
      pcVar4[10] = '\0';
      pcVar4[0xb] = '\0';
      pcVar4[0xc] = '\0';
      pcVar4[0xd] = '\0';
      pcVar4[0xe] = '\0';
      pcVar4[0xf] = '\0';
      lVar33 = lVar33 + 2;
    } while (lVar33 != 4);
    uVar37 = 1;
    goto LAB_00d3d1e0;
  }
  right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
       0x100;
  pTVar10 = (alloc.talloc0)->parent;
  if (alloc.alloc != (pTVar10->alloc)._M_b._M_p) {
    v1.field_0.v[1]._0_1_ = 1;
    v1.field_0.v[0] = (longlong)pTVar10;
    MutexSys::lock(&pTVar10->mutex);
    if ((pTVar10->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((pTVar10->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (pTVar10->alloc1).bytesUsed + (pTVar10->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((pTVar10->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((pTVar10->alloc0).end + (pTVar10->alloc1).end) -
           ((pTVar10->alloc0).cur + (pTVar10->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((pTVar10->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (pTVar10->alloc1).bytesWasted + (pTVar10->alloc0).bytesWasted;
      UNLOCK();
    }
    (pTVar10->alloc0).bytesUsed = 0;
    (pTVar10->alloc0).bytesWasted = 0;
    (pTVar10->alloc0).end = 0;
    (pTVar10->alloc0).allocBlockSize = 0;
    (pTVar10->alloc0).ptr = (char *)0x0;
    (pTVar10->alloc0).cur = 0;
    if (alloc.alloc == (FastAllocator *)0x0) {
      (pTVar10->alloc1).bytesUsed = 0;
      (pTVar10->alloc1).bytesWasted = 0;
      (pTVar10->alloc1).end = 0;
      (pTVar10->alloc1).allocBlockSize = 0;
      (pTVar10->alloc1).ptr = (char *)0x0;
      (pTVar10->alloc1).cur = 0;
    }
    else {
      (pTVar10->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      (pTVar10->alloc1).ptr = (char *)0x0;
      (pTVar10->alloc1).cur = 0;
      (pTVar10->alloc1).end = 0;
      (pTVar10->alloc1).allocBlockSize = 0;
      (pTVar10->alloc1).bytesUsed = 0;
      (pTVar10->alloc1).bytesWasted = 0;
      (pTVar10->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
    }
    LOCK();
    (pTVar10->alloc)._M_b._M_p = alloc.alloc;
    UNLOCK();
    v0.field_0.v[0] = (longlong)&FastAllocator::s_thread_local_allocators_lock;
    v0.field_0.v[1]._0_1_ = 1;
    v2.field_0.v[0] = (longlong)pTVar10;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    iVar11._M_current =
         ((alloc.alloc)->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        ((alloc.alloc)->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&(alloc.alloc)->thread_local_allocators,iVar11,(ThreadLocal2 **)&v2);
    }
    else {
      *iVar11._M_current = (ThreadLocal2 *)v2.field_0.v[0];
      pppTVar2 = &((alloc.alloc)->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar2 = *pppTVar2 + 1;
    }
    if (v0.field_0.v[1]._0_1_ == '\x01') {
      MutexSys::unlock((MutexSys *)v0.field_0.v[0]);
    }
    if (v1.field_0.v[1]._0_1_ == '\x01') {
      MutexSys::unlock((MutexSys *)v1.field_0.v[0]);
    }
  }
  (alloc.talloc0)->bytesUsed =
       (alloc.talloc0)->bytesUsed +
       right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_;
  sVar39 = (alloc.talloc0)->cur;
  uVar37 = (ulong)(-(int)sVar39 & 0xf);
  uVar57 = sVar39 + right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                    field_0._0_8_ + uVar37;
  (alloc.talloc0)->cur = uVar57;
  if ((alloc.talloc0)->end < uVar57) {
    (alloc.talloc0)->cur = sVar39;
    if ((alloc.talloc0)->allocBlockSize <
        (ulong)(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                field_0._0_8_ << 2)) {
      pcVar44 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&right);
    }
    else {
      v0.field_0.v[0] = (alloc.talloc0)->allocBlockSize;
      pcVar44 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&v0);
      (alloc.talloc0)->ptr = pcVar44;
      sVar39 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
      (alloc.talloc0)->bytesWasted = sVar39;
      (alloc.talloc0)->cur = 0;
      (alloc.talloc0)->end = v0.field_0.v[0];
      (alloc.talloc0)->cur =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _0_8_;
      if ((ulong)v0.field_0.v[0] <
          (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                 field_0._0_8_) {
        (alloc.talloc0)->cur = 0;
        v0.field_0.v[0] = (alloc.talloc0)->allocBlockSize;
        pcVar44 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&v0);
        (alloc.talloc0)->ptr = pcVar44;
        sVar39 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar39;
        (alloc.talloc0)->cur = 0;
        (alloc.talloc0)->end = v0.field_0.v[0];
        (alloc.talloc0)->cur =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        if ((ulong)v0.field_0.v[0] <
            (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                   field_0._0_8_) {
          (alloc.talloc0)->cur = 0;
          pcVar44 = (char *)0x0;
          goto LAB_00d3d074;
        }
      }
      (alloc.talloc0)->bytesWasted = sVar39;
    }
  }
  else {
    (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar37;
    pcVar44 = (alloc.talloc0)->ptr +
              (uVar57 - right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                        lower.field_0._0_8_);
  }
LAB_00d3d074:
  pcVar44[0xe0] = '\0';
  pcVar44[0xe1] = '\0';
  pcVar44[0xe2] = -0x80;
  pcVar44[0xe3] = '\x7f';
  pcVar44[0xe4] = '\0';
  pcVar44[0xe5] = '\0';
  pcVar44[0xe6] = -0x80;
  pcVar44[0xe7] = '\x7f';
  pcVar44[0xe8] = '\0';
  pcVar44[0xe9] = '\0';
  pcVar44[0xea] = -0x80;
  pcVar44[0xeb] = '\x7f';
  pcVar44[0xec] = '\0';
  pcVar44[0xed] = '\0';
  pcVar44[0xee] = -0x80;
  pcVar44[0xef] = '\x7f';
  pcVar44[0xf0] = '\0';
  pcVar44[0xf1] = '\0';
  pcVar44[0xf2] = -0x80;
  pcVar44[0xf3] = -1;
  pcVar44[0xf4] = '\0';
  pcVar44[0xf5] = '\0';
  pcVar44[0xf6] = -0x80;
  pcVar44[0xf7] = -1;
  pcVar44[0xf8] = '\0';
  pcVar44[0xf9] = '\0';
  pcVar44[0xfa] = -0x80;
  pcVar44[0xfb] = -1;
  pcVar44[0xfc] = '\0';
  pcVar44[0xfd] = '\0';
  pcVar44[0xfe] = -0x80;
  pcVar44[0xff] = -1;
  pcVar44[0x60] = '\0';
  pcVar44[0x61] = '\0';
  pcVar44[0x62] = -0x80;
  pcVar44[99] = '\x7f';
  pcVar44[100] = '\0';
  pcVar44[0x65] = '\0';
  pcVar44[0x66] = -0x80;
  pcVar44[0x67] = '\x7f';
  pcVar44[0x68] = '\0';
  pcVar44[0x69] = '\0';
  pcVar44[0x6a] = -0x80;
  pcVar44[0x6b] = '\x7f';
  pcVar44[0x6c] = '\0';
  pcVar44[0x6d] = '\0';
  pcVar44[0x6e] = -0x80;
  pcVar44[0x6f] = '\x7f';
  pcVar44[0x40] = '\0';
  pcVar44[0x41] = '\0';
  pcVar44[0x42] = -0x80;
  pcVar44[0x43] = '\x7f';
  pcVar44[0x44] = '\0';
  pcVar44[0x45] = '\0';
  pcVar44[0x46] = -0x80;
  pcVar44[0x47] = '\x7f';
  pcVar44[0x48] = '\0';
  pcVar44[0x49] = '\0';
  pcVar44[0x4a] = -0x80;
  pcVar44[0x4b] = '\x7f';
  pcVar44[0x4c] = '\0';
  pcVar44[0x4d] = '\0';
  pcVar44[0x4e] = -0x80;
  pcVar44[0x4f] = '\x7f';
  pcVar44[0x20] = '\0';
  pcVar44[0x21] = '\0';
  pcVar44[0x22] = -0x80;
  pcVar44[0x23] = '\x7f';
  pcVar44[0x24] = '\0';
  pcVar44[0x25] = '\0';
  pcVar44[0x26] = -0x80;
  pcVar44[0x27] = '\x7f';
  pcVar44[0x28] = '\0';
  pcVar44[0x29] = '\0';
  pcVar44[0x2a] = -0x80;
  pcVar44[0x2b] = '\x7f';
  pcVar44[0x2c] = '\0';
  pcVar44[0x2d] = '\0';
  pcVar44[0x2e] = -0x80;
  pcVar44[0x2f] = '\x7f';
  pcVar44[0x70] = '\0';
  pcVar44[0x71] = '\0';
  pcVar44[0x72] = -0x80;
  pcVar44[0x73] = -1;
  pcVar44[0x74] = '\0';
  pcVar44[0x75] = '\0';
  pcVar44[0x76] = -0x80;
  pcVar44[0x77] = -1;
  pcVar44[0x78] = '\0';
  pcVar44[0x79] = '\0';
  pcVar44[0x7a] = -0x80;
  pcVar44[0x7b] = -1;
  pcVar44[0x7c] = '\0';
  pcVar44[0x7d] = '\0';
  pcVar44[0x7e] = -0x80;
  pcVar44[0x7f] = -1;
  pcVar44[0x50] = '\0';
  pcVar44[0x51] = '\0';
  pcVar44[0x52] = -0x80;
  pcVar44[0x53] = -1;
  pcVar44[0x54] = '\0';
  pcVar44[0x55] = '\0';
  pcVar44[0x56] = -0x80;
  pcVar44[0x57] = -1;
  pcVar44[0x58] = '\0';
  pcVar44[0x59] = '\0';
  pcVar44[0x5a] = -0x80;
  pcVar44[0x5b] = -1;
  pcVar44[0x5c] = '\0';
  pcVar44[0x5d] = '\0';
  pcVar44[0x5e] = -0x80;
  pcVar44[0x5f] = -1;
  pcVar44[0x30] = '\0';
  pcVar44[0x31] = '\0';
  pcVar44[0x32] = -0x80;
  pcVar44[0x33] = -1;
  pcVar44[0x34] = '\0';
  pcVar44[0x35] = '\0';
  pcVar44[0x36] = -0x80;
  pcVar44[0x37] = -1;
  pcVar44[0x38] = '\0';
  pcVar44[0x39] = '\0';
  pcVar44[0x3a] = -0x80;
  pcVar44[0x3b] = -1;
  pcVar44[0x3c] = '\0';
  pcVar44[0x3d] = '\0';
  pcVar44[0x3e] = -0x80;
  pcVar44[0x3f] = -1;
  pcVar44[0x80] = '\0';
  pcVar44[0x81] = '\0';
  pcVar44[0x82] = '\0';
  pcVar44[0x83] = '\0';
  pcVar44[0x84] = '\0';
  pcVar44[0x85] = '\0';
  pcVar44[0x86] = '\0';
  pcVar44[0x87] = '\0';
  pcVar44[0x88] = '\0';
  pcVar44[0x89] = '\0';
  pcVar44[0x8a] = '\0';
  pcVar44[0x8b] = '\0';
  pcVar44[0x8c] = '\0';
  pcVar44[0x8d] = '\0';
  pcVar44[0x8e] = '\0';
  pcVar44[0x8f] = '\0';
  pcVar44[0x90] = '\0';
  pcVar44[0x91] = '\0';
  pcVar44[0x92] = '\0';
  pcVar44[0x93] = '\0';
  pcVar44[0x94] = '\0';
  pcVar44[0x95] = '\0';
  pcVar44[0x96] = '\0';
  pcVar44[0x97] = '\0';
  pcVar44[0x98] = '\0';
  pcVar44[0x99] = '\0';
  pcVar44[0x9a] = '\0';
  pcVar44[0x9b] = '\0';
  pcVar44[0x9c] = '\0';
  pcVar44[0x9d] = '\0';
  pcVar44[0x9e] = '\0';
  pcVar44[0x9f] = '\0';
  pcVar44[0xa0] = '\0';
  pcVar44[0xa1] = '\0';
  pcVar44[0xa2] = '\0';
  pcVar44[0xa3] = '\0';
  pcVar44[0xa4] = '\0';
  pcVar44[0xa5] = '\0';
  pcVar44[0xa6] = '\0';
  pcVar44[0xa7] = '\0';
  pcVar44[0xa8] = '\0';
  pcVar44[0xa9] = '\0';
  pcVar44[0xaa] = '\0';
  pcVar44[0xab] = '\0';
  pcVar44[0xac] = '\0';
  pcVar44[0xad] = '\0';
  pcVar44[0xae] = '\0';
  pcVar44[0xaf] = '\0';
  pcVar44[0xb0] = '\0';
  pcVar44[0xb1] = '\0';
  pcVar44[0xb2] = '\0';
  pcVar44[0xb3] = '\0';
  pcVar44[0xb4] = '\0';
  pcVar44[0xb5] = '\0';
  pcVar44[0xb6] = '\0';
  pcVar44[0xb7] = '\0';
  pcVar44[0xb8] = '\0';
  pcVar44[0xb9] = '\0';
  pcVar44[0xba] = '\0';
  pcVar44[0xbb] = '\0';
  pcVar44[0xbc] = '\0';
  pcVar44[0xbd] = '\0';
  pcVar44[0xbe] = '\0';
  pcVar44[0xbf] = '\0';
  pcVar44[0xc0] = '\0';
  pcVar44[0xc1] = '\0';
  pcVar44[0xc2] = '\0';
  pcVar44[0xc3] = '\0';
  pcVar44[0xc4] = '\0';
  pcVar44[0xc5] = '\0';
  pcVar44[0xc6] = '\0';
  pcVar44[199] = '\0';
  pcVar44[200] = '\0';
  pcVar44[0xc9] = '\0';
  pcVar44[0xca] = '\0';
  pcVar44[0xcb] = '\0';
  pcVar44[0xcc] = '\0';
  pcVar44[0xcd] = '\0';
  pcVar44[0xce] = '\0';
  pcVar44[0xcf] = '\0';
  pcVar44[0xd0] = '\0';
  pcVar44[0xd1] = '\0';
  pcVar44[0xd2] = '\0';
  pcVar44[0xd3] = '\0';
  pcVar44[0xd4] = '\0';
  pcVar44[0xd5] = '\0';
  pcVar44[0xd6] = '\0';
  pcVar44[0xd7] = '\0';
  pcVar44[0xd8] = '\0';
  pcVar44[0xd9] = '\0';
  pcVar44[0xda] = '\0';
  pcVar44[0xdb] = '\0';
  pcVar44[0xdc] = '\0';
  pcVar44[0xdd] = '\0';
  pcVar44[0xde] = '\0';
  pcVar44[0xdf] = '\0';
  lVar33 = 0;
  do {
    pcVar4 = pcVar44 + lVar33 * 8;
    pcVar4[0] = '\b';
    pcVar4[1] = '\0';
    pcVar4[2] = '\0';
    pcVar4[3] = '\0';
    pcVar4[4] = '\0';
    pcVar4[5] = '\0';
    pcVar4[6] = '\0';
    pcVar4[7] = '\0';
    pcVar4[8] = '\b';
    pcVar4[9] = '\0';
    pcVar4[10] = '\0';
    pcVar4[0xb] = '\0';
    pcVar4[0xc] = '\0';
    pcVar4[0xd] = '\0';
    pcVar4[0xe] = '\0';
    pcVar4[0xf] = '\0';
    lVar33 = lVar33 + 2;
  } while (lVar33 != 4);
  uVar37 = 6;
LAB_00d3d1e0:
  local_1e78._8_8_ = 0xff800000ff800000;
  local_1e78._0_8_ = 0xff800000ff800000;
  local_1e58._8_8_ = 0x7f8000007f800000;
  local_1e58._0_8_ = 0x7f8000007f800000;
  in_00 = (BuildRecord *)&geomID;
  if (local_848 != 0) {
    pBVar55 = &values[0].dt;
    uVar57 = 0;
    local_1e58._8_8_ = 0x7f8000007f800000;
    local_1e58._0_8_ = 0x7f8000007f800000;
    local_1e28._8_8_ = 0x7f8000007f800000;
    local_1e28._0_8_ = 0x7f8000007f800000;
    local_1e78._8_8_ = 0xff800000ff800000;
    local_1e78._0_8_ = 0xff800000ff800000;
    local_1e38._8_8_ = 0xff800000ff800000;
    local_1e38._0_8_ = 0xff800000ff800000;
    do {
      createLargeLeaf((NodeRecordMB4D *)&v0,this,in_00,alloc);
      aVar28 = local_1c58;
      pBVar55[-10].lower = (float)v0.field_0.v[0]._0_4_;
      pBVar55[-10].upper = (float)v0.field_0._4_4_;
      auVar61._8_8_ = local_1c88._8_8_;
      auVar61._0_8_ = local_1c88._0_8_;
      *(undefined1 (*) [16])(pBVar55 + -8) = auVar61;
      pBVar55[-6].lower = (float)local_1c78._0_4_;
      pBVar55[-6].upper = local_1c78.m128[1];
      pBVar55[-5].lower = (float)local_1c78._8_4_;
      pBVar55[-5].upper = local_1c78.m128[3];
      pBVar55[-4].lower = (float)local_1c68._0_4_;
      pBVar55[-4].upper = local_1c68.m128[1];
      pBVar55[-3].lower = (float)local_1c68._8_4_;
      pBVar55[-3].upper = local_1c68.m128[3];
      pBVar55[-2].lower = local_1c58.v[0];
      pBVar55[-2].upper = local_1c58.v[1];
      pBVar55[-1].lower = local_1c58.v[2];
      pBVar55[-1].upper = local_1c58.v[3];
      *pBVar55 = local_1c48;
      local_1e78 = maxps(local_1e78,*(undefined1 (*) [16])(pBVar55 + -6));
      local_1e28 = minps(local_1e28,*(undefined1 (*) [16])(pBVar55 + -4));
      local_1e58 = minps(local_1e58,auVar61);
      local_1e38 = maxps(local_1e38,*(undefined1 (*) [16])(pBVar55 + -2));
      uVar57 = uVar57 + 1;
      pBVar55 = pBVar55 + 0xc;
      in_00 = (BuildRecord *)
              &in_00[1].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
               geomBounds.bounds1.upper;
      local_1c58 = aVar28;
    } while (uVar57 < local_848);
  }
  auVar62 = _DAT_01ff1820;
  auVar61 = _DAT_01ff1810;
  if (((uint)uVar37 | (uint)pcVar44 & 0xf) == 1) {
    if (local_848 != 0) {
      uVar45 = (ulong)pcVar44 & 0xfffffffffffffff0;
      pfVar38 = &values[0].dt.upper;
      uVar57 = 0;
      do {
        *(undefined8 *)(uVar45 + uVar57 * 8) = *(undefined8 *)(pfVar38 + -0x15);
        fVar90 = ((BBox1f *)(pfVar38 + -1))->lower;
        fVar89 = 1.0 / (*pfVar38 - fVar90);
        fVar96 = -fVar90 * fVar89;
        fVar87 = 1.0 - fVar96;
        auVar85._0_4_ = pfVar38[-0x11] * fVar87 + pfVar38[-9] * fVar96;
        auVar85._4_4_ = pfVar38[-0x10] * fVar87 + pfVar38[-8] * fVar96;
        auVar85._8_4_ = pfVar38[-0xf] * fVar87 + pfVar38[-7] * fVar96;
        auVar85._12_4_ = pfVar38[-0xe] * fVar87 + pfVar38[-6] * fVar96;
        auVar88._0_4_ = fVar87 * pfVar38[-0xd] + fVar96 * pfVar38[-5];
        auVar88._4_4_ = fVar87 * pfVar38[-0xc] + fVar96 * pfVar38[-4];
        auVar88._8_4_ = fVar87 * pfVar38[-0xb] + fVar96 * pfVar38[-3];
        auVar88._12_4_ = fVar87 * pfVar38[-10] + fVar96 * pfVar38[-2];
        fVar89 = (1.0 - fVar90) * fVar89;
        fVar90 = 1.0 - fVar89;
        auVar83._0_4_ = pfVar38[-0x11] * fVar90 + pfVar38[-9] * fVar89;
        auVar83._4_4_ = pfVar38[-0x10] * fVar90 + pfVar38[-8] * fVar89;
        auVar83._8_4_ = pfVar38[-0xf] * fVar90 + pfVar38[-7] * fVar89;
        auVar83._12_4_ = pfVar38[-0xe] * fVar90 + pfVar38[-6] * fVar89;
        auVar91._0_4_ = fVar90 * pfVar38[-0xd] + fVar89 * pfVar38[-5];
        auVar91._4_4_ = fVar90 * pfVar38[-0xc] + fVar89 * pfVar38[-4];
        auVar91._8_4_ = fVar90 * pfVar38[-0xb] + fVar89 * pfVar38[-3];
        auVar91._12_4_ = fVar90 * pfVar38[-10] + fVar89 * pfVar38[-2];
        auVar85 = minps(auVar85,auVar62);
        auVar88 = maxps(auVar88,auVar61);
        auVar83 = minps(auVar83,auVar62);
        auVar91 = maxps(auVar91,auVar61);
        fVar90 = auVar85._0_4_ - ABS(auVar85._0_4_) * 4.7683716e-07;
        fVar87 = auVar85._4_4_ - ABS(auVar85._4_4_) * 4.7683716e-07;
        fVar89 = auVar85._8_4_ - ABS(auVar85._8_4_) * 4.7683716e-07;
        fVar96 = ABS(auVar88._0_4_) * 4.7683716e-07 + auVar88._0_4_;
        fVar94 = ABS(auVar88._4_4_) * 4.7683716e-07 + auVar88._4_4_;
        fVar95 = ABS(auVar88._8_4_) * 4.7683716e-07 + auVar88._8_4_;
        *(float *)(uVar45 + 0x20 + uVar57 * 4) = fVar90;
        *(float *)(uVar45 + 0x40 + uVar57 * 4) = fVar87;
        *(float *)(uVar45 + 0x60 + uVar57 * 4) = fVar89;
        *(float *)(uVar45 + 0x30 + uVar57 * 4) = fVar96;
        *(float *)(uVar45 + 0x50 + uVar57 * 4) = fVar94;
        *(float *)(uVar45 + 0x70 + uVar57 * 4) = fVar95;
        *(float *)(uVar45 + 0x80 + uVar57 * 4) =
             (auVar83._0_4_ - ABS(auVar83._0_4_) * 4.7683716e-07) - fVar90;
        *(float *)(uVar45 + 0xa0 + uVar57 * 4) =
             (auVar83._4_4_ - ABS(auVar83._4_4_) * 4.7683716e-07) - fVar87;
        *(float *)(uVar45 + 0xc0 + uVar57 * 4) =
             (auVar83._8_4_ - ABS(auVar83._8_4_) * 4.7683716e-07) - fVar89;
        *(float *)(uVar45 + 0x90 + uVar57 * 4) =
             (ABS(auVar91._0_4_) * 4.7683716e-07 + auVar91._0_4_) - fVar96;
        *(float *)(uVar45 + 0xb0 + uVar57 * 4) =
             (ABS(auVar91._4_4_) * 4.7683716e-07 + auVar91._4_4_) - fVar94;
        *(float *)(uVar45 + 0xd0 + uVar57 * 4) =
             (ABS(auVar91._8_4_) * 4.7683716e-07 + auVar91._8_4_) - fVar95;
        uVar57 = uVar57 + 1;
        pfVar38 = pfVar38 + 0x18;
      } while (local_848 != uVar57);
    }
  }
  else {
    BuilderT<embree::NodeRefPtr<4>,embree::sse2::RecalculatePrimRef<embree::QuadMesh>,embree::FastAllocator::CachedAllocator,embree::BVHN<4>::CreateAlloc,embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,4>::Create,embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,4>::Set,embree::sse2::CreateMSMBlurLeaf<4,embree::QuadMesh,embree::QuadMi<4>>,embree::Scene::BuildProgressMonitorInterface>
    ::createLargeLeaf();
  }
  uVar45 = uStack_1860;
  uVar57 = local_1868;
  if (bVar26) {
    vSplitPos.field_0.v[1] = (longlong)&this->recalculatePrimRef;
    vSplitPos.field_0.v[0] = (longlong)&local_18c8;
    v1.field_0.v[0] = 0x7f8000007f800000;
    v1.field_0.v[1] = 0x7f8000007f800000;
    local_1b38._0_8_ = 0xff800000ff800000;
    local_1b38._8_8_ = 0xff800000ff800000;
    local_1b28 = 0x7f8000007f800000;
    BStack_1b20.lower = INFINITY;
    BStack_1b20.upper = INFINITY;
    local_1b18.lower = -INFINITY;
    local_1b18.upper = -INFINITY;
    uStack_1b10 = 0xff800000ff800000;
    if (uStack_1860 - local_1868 < 0xc00) {
      v0.field_0.v[0] = local_1868;
      v0.field_0.v[1] = uStack_1860;
      ::anon_func::anon_class_16_2_aeee9775::operator()
                ((LBBox3fa *)&v2,(anon_class_16_2_aeee9775 *)&vSplitPos,(range<unsigned_long> *)&v0)
      ;
    }
    else {
      v0.field_0.v[1]._4_2_ = 0x401;
      local_1c78.m128[0] = 0.0;
      local_1c78.m128[1] = 0.0;
      local_1c78.m128[2] = 0.0;
      local_1c78.m128[3] = 0.0;
      local_1c58._0_8_ = 8;
      tbb::detail::r1::initialize((task_group_context *)&v0);
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
           uVar45;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_ =
           uVar57;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_ =
           0x400;
      isLeft.split = (Split *)&vSplitMask;
      isLeft.vSplitPos = &vSplitPos;
      tbb::detail::d1::
      parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::LBBox<embree::Vec3fa>,embree::parallel_reduce<unsigned_long,embree::LBBox<embree::Vec3fa>,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::QuadMesh>>(embree::sse2::RecalculatePrimRef<embree::QuadMesh>const&)const::_lambda(embree::range<unsigned_long>const&)_1_,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::QuadMesh>>(embree::sse2::RecalculatePrimRef<embree::QuadMesh>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>(unsigned_long,unsigned_long,unsigned_long,embree::LBBox<embree::Vec3fa>const&,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::QuadMesh>>(embree::sse2::RecalculatePrimRef<embree::QuadMesh>const&)const::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::QuadMesh>>(embree::sse2::RecalculatePrimRef<embree::QuadMesh>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::LBBox<embree::Vec3fa>const&)_1_,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::QuadMesh>>(embree::sse2::RecalculatePrimRef<embree::QuadMesh>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>
                ((LBBox<embree::Vec3fa> *)&v2,(d1 *)&right,(blocked_range<unsigned_long> *)&v1,
                 (LBBox<embree::Vec3fa> *)&isLeft,
                 (anon_class_16_2_ed117de8_conflict31 *)isLeft.split,(anon_class_1_0_00000001 *)&v0,
                 in_stack_ffffffffffffe168);
      cVar31 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&v0);
      if (cVar31 != '\0') {
        prVar41 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar41,"task cancelled");
        __cxa_throw(prVar41,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::r1::destroy((task_group_context *)&v0);
    }
    (__return_storage_ptr__->ref).ptr = uVar37 | (ulong)pcVar44;
    *(longlong *)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 = v2.field_0.v[0];
    *(longlong *)((long)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 + 8) =
         v2.field_0.v[1];
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 = local_1d18._0_8_;
    pBVar55 = (BBox1f *)((long)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 + 8);
    pBVar55->lower = (float)local_1d18._8_4_;
    pBVar55->upper = local_1d18.m128[3];
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 = local_1d08._0_8_;
    pBVar55 = (BBox1f *)((long)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 + 8);
    pBVar55->lower = (float)local_1d08._8_4_;
    pBVar55->upper = local_1d08.v[3];
  }
  else {
    (__return_storage_ptr__->ref).ptr = uVar37 | (ulong)pcVar44;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 = local_1e58._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 + 8) =
         local_1e58._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 = local_1e78._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 + 8) =
         local_1e78._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 = local_1e28._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 + 8) =
         local_1e28._8_8_;
    local_1cf8._0_8_ = local_1e38._0_8_;
    local_1cf8._8_8_ = local_1e38._8_8_;
  }
  *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 = local_1cf8._0_8_;
  *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 + 8) =
       local_1cf8._8_8_;
  __return_storage_ptr__->dt = BStack_1840;
  if (local_848 == 0) {
    return __return_storage_ptr__;
  }
  uVar37 = 0;
  do {
    pBVar12 = local_8c8[uVar37];
    pBVar55 = pBVar12 + 1;
    *pBVar55 = (BBox1f)((long)*pBVar55 + -1);
    if ((*pBVar55 == (BBox1f)0x0) && (BVar5 = *pBVar12, BVar5 != (BBox1f)0x0)) {
      lVar33 = *(undefined8 *)((long)BVar5 + 0x18);
      pvVar36 = *(void **)((long)BVar5 + 0x20);
      if (pvVar36 != (void *)0x0) {
        if ((ulong)(lVar33 * 0x50) < 0x1c00000) {
          alignedFree(pvVar36);
        }
        else {
          os_free(pvVar36,lVar33 * 0x50,*(bool *)((long)BVar5 + 8));
        }
      }
      if (lVar33 != 0) {
        (**(code **)**(undefined8 **)BVar5)(*(undefined8 **)BVar5,lVar33 * -0x50,1);
      }
      *(undefined8 *)((long)BVar5 + 0x10) = 0;
      *(undefined8 *)((long)BVar5 + 0x18) = 0;
      *(undefined8 *)((long)BVar5 + 0x20) = 0;
      operator_delete((void *)BVar5);
    }
    uVar37 = uVar37 + 1;
  } while (uVar37 < local_848);
  return __return_storage_ptr__;
}

Assistant:

const NodeRecordMB4D createLargeLeaf(const BuildRecord& in, Allocator alloc)
          {
            /* this should never occur but is a fatal error */
            if (in.depth > cfg.maxDepth)
              throw_RTCError(RTC_ERROR_UNKNOWN,"depth limit reached");

            /* replace already found split by fallback split */
            const BuildRecordSplit current(BuildRecord(in.prims,in.depth),findFallback(in.prims));

            /* special case when directly creating leaf without any splits that could shrink time_range */
            bool force_split = false;
            if (current.depth == 1 && current.size() > 0)
            {
              BBox1f c = empty;
              BBox1f p = current.prims.time_range;
              for (size_t i=current.prims.begin(); i<current.prims.end(); i++) {
                mvector<PrimRefMB>& prims = *current.prims.prims;
                c.extend(prims[i].time_range);
              }
              
              force_split = c.lower > p.lower || c.upper < p.upper;
            }
	    
            /* create leaf for few primitives */
            if (current.size() <= cfg.maxLeafSize && current.split.data < Split::SPLIT_ENFORCE && !force_split)
              return createLeaf(current,alloc);
	  
            /* fill all children by always splitting the largest one */
            bool hasTimeSplits = false;
            NodeRecordMB4D values[MAX_BRANCHING_FACTOR];
            LocalChildListSplit children(current);

            do {
              /* find best child with largest bounding box area */
              size_t bestChild = -1;
              size_t bestSize = 0;
              for (size_t i=0; i<children.size(); i++)
              {
                /* ignore leaves as they cannot get split */
                if (children[i].size() <= cfg.maxLeafSize && children[i].split.data < Split::SPLIT_ENFORCE && !force_split)
                  continue;

                force_split = false;
                
                /* remember child with largest size */
                if (children[i].size() > bestSize) {
                  bestSize = children[i].size();
                  bestChild = i;
                }
              }
              if (bestChild == -1) break;

              /* perform best found split */
              BuildRecordSplit& brecord = children[bestChild];
              BuildRecordSplit lrecord(current.depth+1);
              BuildRecordSplit rrecord(current.depth+1);
              std::unique_ptr<mvector<PrimRefMB>> new_vector = split(brecord.split,brecord.prims,lrecord.prims,rrecord.prims);
              hasTimeSplits |= new_vector != nullptr;

              /* find new splits */
              lrecord.split = findFallback(lrecord.prims);
              rrecord.split = findFallback(rrecord.prims);
              children.split(bestChild,lrecord,rrecord,std::move(new_vector));

            } while (children.size() < cfg.branchingFactor);

            /* detect time_ranges that have shrunken */
            for (size_t i=0; i<children.size(); i++) {
              const BBox1f c = children[i].prims.time_range;
              const BBox1f p = in.prims.time_range;
              hasTimeSplits |= c.lower > p.lower || c.upper < p.upper;
            }

            /* create node */
            auto node = createNode(children.children.data(),children.numChildren,alloc,hasTimeSplits);

            /* recurse into each child and perform reduction */
            LBBox3fa gbounds = empty;
            for (size_t i=0; i<children.size(); i++) {
              values[i] = createLargeLeaf(children[i],alloc);
              gbounds.extend(values[i].lbounds);
            }

            setNode(current,children.children.data(),node,values,children.numChildren);

            /* calculate geometry bounds of this node */
            if (hasTimeSplits)
              return NodeRecordMB4D(node,current.prims.linearBounds(recalculatePrimRef),current.prims.time_range);
            else
              return NodeRecordMB4D(node,gbounds,current.prims.time_range);
          }